

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::avx::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::avx::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  char *pcVar3;
  float fVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  task_group_context *ptVar8;
  MemoryMonitorInterface *pMVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar11;
  anon_union_8_2_d71db6ad_for_task_group_context_11 aVar12;
  iterator iVar13;
  BBox1f *pBVar14;
  Geometry *pGVar15;
  float fVar16;
  float fVar18;
  undefined1 auVar19 [16];
  anon_union_8_2_d71db6ad_for_task_group_context_11 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  BuilderT<embree::NodeRefPtr<4>,_embree::avx::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
  *this_00;
  range<unsigned_long> rVar29;
  SubGridBuildData *pSVar30;
  undefined8 uVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar32;
  BBox1f BVar33;
  BBox1f BVar34;
  BBox1f BVar35;
  char cVar36;
  uint uVar37;
  int iVar38;
  long lVar39;
  BBox1f BVar40;
  void *pvVar41;
  ulong uVar42;
  float *pfVar43;
  long lVar44;
  undefined1 (*pauVar45) [16];
  ulong uVar46;
  size_t sVar47;
  undefined8 *puVar48;
  runtime_error *prVar49;
  int iVar50;
  BBox1f *pBVar51;
  undefined8 uVar52;
  uint *puVar53;
  ulong uVar54;
  long lVar55;
  ushort uVar56;
  unsigned_long uVar57;
  mvector<PrimRefMB> *prims;
  ulong uVar58;
  ushort uVar59;
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  undefined4 uVar63;
  byte bVar64;
  char *pcVar65;
  ulong uVar66;
  anon_union_8_2_d71db6ad_for_task_group_context_11 *in_00;
  long lVar67;
  ulong uVar68;
  bool bVar69;
  float fVar79;
  float fVar80;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  unsigned_long uVar81;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar82;
  undefined1 auVar78 [32];
  float fVar90;
  float fVar91;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar92;
  float fVar96;
  float fVar97;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [64];
  float fVar143;
  float fVar147;
  float fVar148;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar149;
  undefined1 auVar146 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar159;
  float fVar160;
  undefined1 auVar157 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar158;
  float fVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [64];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  BBox1f time_range1;
  BBox1f time_range0;
  PrimRefVector lprims;
  uint x [4];
  uint geomIDs [4];
  BBox3fa bounds0 [4];
  anon_class_1_0_00000001 reduction;
  BBox3fa bounds1 [4];
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  uint y [4];
  uint primID [4];
  NodeRecordMB4D values [16];
  AABBNode node0;
  task_group_context *in_stack_ffffffffffffe080;
  BBox1f local_1f48;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1f40;
  BuilderT<embree::NodeRefPtr<4>,_embree::avx::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::avx::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
  *local_1f28;
  range<unsigned_long> local_1f20;
  anon_union_8_2_d71db6ad_for_task_group_context_11 *local_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1ef0;
  undefined1 local_1ee0 [12];
  undefined4 uStack_1ed4;
  PrimRefMB *local_1ec8;
  undefined1 local_1ec0 [16];
  uint local_1eb0;
  undefined4 uStack_1eac;
  undefined8 uStack_1ea8;
  HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::VirtualRecalculatePrimRef,_2UL>
  *local_1e98;
  anon_union_8_2_d71db6ad_for_task_group_context_11 *local_1e90;
  undefined8 uStack_1e88;
  NodeRecordMB4D *local_1e78;
  undefined1 local_1e70 [16];
  undefined1 local_1e60 [16];
  undefined1 local_1e50 [16];
  ulong local_1e38;
  long local_1e30;
  BBox1f local_1e28 [3];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e10;
  undefined8 uStack_1e00;
  undefined4 uStack_1df8;
  undefined4 uStack_1df4;
  undefined4 local_1df0;
  undefined4 uStack_1dec;
  undefined4 uStack_1de8;
  undefined4 uStack_1de4;
  undefined4 uStack_1de0;
  undefined4 uStack_1ddc;
  undefined4 uStack_1dd8;
  undefined4 uStack_1dd4;
  undefined4 local_1dd0;
  undefined4 uStack_1dcc;
  undefined4 uStack_1dc8;
  undefined4 uStack_1dc4;
  undefined4 uStack_1dc0;
  undefined4 uStack_1dbc;
  float fStack_1db8;
  float fStack_1db4;
  BBox1f local_1db0;
  size_t sStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined4 local_1d90;
  undefined4 uStack_1d8c;
  undefined4 uStack_1d88;
  undefined4 uStack_1d84;
  ulong local_1d80;
  BBox1f local_1d78;
  char *local_1d70;
  ulong local_1d68;
  undefined1 local_1d60 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1d50;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1d40;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aStack_1d30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1d10;
  BBox1f local_1d00;
  BBox1f BStack_1cf8;
  size_t sStack_1cf0;
  size_t sStack_1ce8;
  float local_1ce0;
  float fStack_1cdc;
  float fStack_1cd8;
  float fStack_1cd4;
  undefined1 local_1cd0 [12];
  undefined2 uStack_1cc4;
  undefined2 uStack_1cc2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cc0 [4];
  BBox1f local_1c80;
  BBox1f BStack_1c78;
  BBox1f BStack_1c70;
  BBox1f BStack_1c68;
  BBox1f local_1c60;
  BBox1f BStack_1c58;
  BBox1f BStack_1c50;
  BBox1f BStack_1c48;
  undefined1 auStack_1c40 [16];
  BBox1f local_1c30;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_1c20;
  undefined8 uStack_1c18;
  BBox1f local_1c10;
  BBox1f local_1c00;
  BBox1f BStack_1bf8;
  BBox1f BStack_1bf0;
  BBox1f BStack_1be8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bd8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bc8;
  undefined1 auStack_1bb8 [12];
  undefined4 uStack_1bac;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1ba8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1b98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_1b88;
  unsigned_long uStack_1b78;
  unsigned_long local_1b70;
  size_t sStack_1b68;
  size_t sStack_1b60;
  BBox1f BStack_1b58;
  BBox1f local_1b50;
  size_t sStack_1b48;
  BBox1f BStack_1b40;
  size_t sStack_1b38;
  undefined1 auStack_1b30 [16];
  BBox1f local_1b20;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_1b10;
  undefined8 uStack_1b08;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_1b00;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_1af0;
  anon_union_8_2_d71db6ad_for_task_group_context_11 aStack_1ae8;
  anon_union_8_2_d71db6ad_for_task_group_context_11 aStack_1ae0;
  anon_union_8_2_d71db6ad_for_task_group_context_11 aStack_1ad8;
  undefined1 local_1ad0 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ac0;
  HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::VirtualRecalculatePrimRef,_2UL>
  *local_1ab0;
  BBox1f *local_1aa8;
  anon_union_8_2_d71db6ad_for_task_group_context_11 *local_1aa0;
  size_t local_1a90;
  BBox1f local_1a88;
  SubGridBuildData *local_1a80;
  ulong local_1a78;
  char *local_1a70;
  anon_class_24_3_35f68c7c local_1a68;
  undefined1 local_1a50 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a00;
  undefined4 local_19f0;
  undefined4 uStack_19ec;
  undefined4 uStack_19e8;
  undefined4 uStack_19e4;
  size_t local_19e0;
  size_t sStack_19d8;
  BBox1f BStack_19d0;
  BBox1f BStack_19c8;
  undefined4 local_19c0;
  undefined8 local_19bc;
  undefined4 local_19b4;
  undefined1 local_19b0 [12];
  undefined4 uStack_19a4;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_19a0;
  intrusive_list_node *local_1990;
  intrusive_list_node *piStack_1988;
  string_resource_index local_1970;
  task_group_context *local_1930;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1920;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1910;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1900;
  undefined1 local_18f0 [16];
  undefined1 local_18e0 [16];
  undefined1 local_18d0 [16];
  BBox1f local_18c0;
  BBox1f BStack_18b8;
  BBox1f BStack_18b0;
  size_t sStack_18a8;
  BBox1f BStack_18a0;
  BBox1f BStack_1898;
  BBox1f local_1890;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_1880;
  undefined8 uStack_1878;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_1870;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  BBox1f local_1840;
  size_t sStack_1838;
  BBox1f BStack_1830;
  BBox1f BStack_1828;
  float local_1820 [12];
  BBox1f local_17f0;
  undefined4 uStack_17e8;
  undefined4 uStack_17e4;
  undefined4 local_17e0 [357];
  undefined8 uStack_124c;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_1240;
  long lStack_1238;
  anon_union_8_2_d71db6ad_for_task_group_context_11 aStack_1230;
  BBox1f BStack_1228;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1220;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aStack_1210;
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [12];
  undefined4 uStack_11d4;
  BBox1f local_11d0;
  undefined4 uStack_11c8;
  undefined4 uStack_11c4;
  BBox1f BStack_11c0;
  size_t sStack_11b8;
  BBox1f local_11b0;
  BBox1f BStack_11a8;
  uint uStack_11a4;
  BBox1f local_11a0 [2];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1190;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_1180 [4];
  undefined8 local_1160;
  undefined8 uStack_1158;
  BBox1f *local_340 [16];
  ulong local_2c0;
  BBox1f local_2b8;
  BBox1f local_2b0 [63];
  long local_b8;
  float fVar17;
  
  local_1e60._8_8_ = local_1e60._0_8_;
  local_1e50._8_8_ = local_1e50._0_8_;
  local_1ad0._8_8_ = local_1ad0._0_8_;
  ptVar8 = (task_group_context *)in->depth;
  local_1e78 = __return_storage_ptr__;
  if ((task_group_context *)(this->cfg).maxDepth < ptVar8) {
    puVar48 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_1240.my_parent = (task_group_context *)&aStack_1230;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1240,"depth limit reached","");
    *puVar48 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar48 + 1) = 1;
    puVar48[2] = puVar48 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar48 + 2),local_1240.my_parent,
               (local_1240.my_parent)->padding + lStack_1238 + -0x48);
    __cxa_throw(puVar48,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  _local_1ee0 = *(undefined1 (*) [16])
                 (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.lower.field_0.m128;
  local_1f40 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds0.upper.field_0;
  local_1ef0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 geomBounds.bounds1.lower.field_0;
  uVar52 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
             bounds1.upper.field_0;
  uStack_1ea8 = *(undefined8 *)
                 ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .geomBounds.bounds1.upper.field_0 + 8);
  local_1eb0 = (uint)uVar52;
  uStack_1eac = (undefined4)((ulong)uVar52 >> 0x20);
  uVar52 = *(undefined8 *)
            &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
             lower.field_0;
  uStack_1ef8 = *(undefined8 *)
                 ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .centBounds.lower.field_0 + 8);
  local_1f00._0_4_ = (undefined4)uVar52;
  local_1f00._4_4_ = (undefined4)((ulong)uVar52 >> 0x20);
  local_1e90 = *(anon_union_8_2_d71db6ad_for_task_group_context_11 **)
                &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                 centBounds.upper.field_0;
  uStack_1e88 = *(undefined8 *)
                 ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>
                         .centBounds.upper.field_0 + 8);
  local_1840 = (BBox1f)(in->prims).super_PrimInfoMB.num_time_segments;
  sStack_1838 = (in->prims).super_PrimInfoMB.max_num_time_segments;
  BStack_1830 = (in->prims).super_PrimInfoMB.max_time_range;
  BStack_1828 = (in->prims).super_PrimInfoMB.time_range;
  BVar40 = (BBox1f)(in->prims).prims;
  local_1f20 = (in->prims).super_PrimInfoMB.object_range;
  findFallback((Split *)&local_1240,this,&in->prims);
  local_1180[0] = aStack_1230;
  local_1190._0_8_ = local_1240;
  auVar71 = _local_1ee0;
  rVar29 = local_1f20;
  local_18d0._8_8_ = uStack_1e88;
  local_18d0._0_8_ = local_1e90;
  local_18e0._4_4_ = local_1f00._4_4_;
  local_18e0._0_4_ = (undefined4)local_1f00;
  local_18e0._8_8_ = uStack_1ef8;
  local_18f0._4_4_ = uStack_1eac;
  local_18f0._0_4_ = local_1eb0;
  local_18f0._8_8_ = uStack_1ea8;
  local_1930 = ptVar8;
  local_1920._0_8_ = local_1ee0._0_8_;
  local_1920.m128[2] = (float)local_1ee0._8_4_;
  local_1920.m128[3] = uStack_1ed4;
  local_1910 = local_1f40;
  local_1900 = local_1ef0;
  uVar57 = local_1f20._begin;
  local_18c0.lower = (float)(undefined4)local_1f20._begin;
  local_18c0.upper = (float)local_1f20._begin._4_4_;
  BStack_18b8.lower = (float)(undefined4)local_1f20._end;
  BStack_18b8.upper = (float)local_1f20._end._4_4_;
  BStack_18b0 = local_1840;
  sStack_18a8 = sStack_1838;
  BStack_18a0 = BStack_1830;
  BStack_1898 = BStack_1828;
  BVar34 = BStack_1898;
  local_1890 = BVar40;
  local_1880 = local_1240;
  uStack_1878 = lStack_1238;
  local_1870 = aStack_1230;
  local_1180[2] = (anon_union_8_2_d71db6ad_for_task_group_context_11)local_1220._0_8_;
  local_1180[3] = (anon_union_8_2_d71db6ad_for_task_group_context_11)local_1220._8_8_;
  local_1160 = aStack_1210._0_8_;
  uStack_1158 = aStack_1210._8_8_;
  local_1860 = local_1220._0_8_;
  uStack_1858 = local_1220._8_8_;
  uStack_1850 = aStack_1210._0_8_;
  uStack_1848 = aStack_1210._8_8_;
  local_1ad0._0_8_ = in;
  if ((ptVar8 == (task_group_context *)0x1) && (local_1f20._end != local_1f20._begin)) {
    BStack_1898.lower = BStack_1828.lower;
    BStack_1898.upper = BStack_1828.upper;
    lVar39 = local_1f20._end - local_1f20._begin;
    if (local_1f20._end < local_1f20._begin || lVar39 == 0) {
      auVar73 = ZEXT816(0xff8000007f800000);
    }
    else {
      pBVar51 = &(*(PrimRefMB **)((long)BVar40 + 0x20))[local_1f20._begin].time_range;
      auVar73 = ZEXT816(0xff8000007f800000);
      do {
        auVar99._8_8_ = 0;
        auVar99._0_4_ = pBVar51->lower;
        auVar99._4_4_ = pBVar51->upper;
        auVar72 = vcmpps_avx(auVar73,auVar99,1);
        auVar85 = vinsertps_avx(auVar73,auVar99,0x50);
        auVar73 = vblendps_avx(auVar99,auVar73,2);
        auVar73 = vblendvps_avx(auVar73,auVar85,auVar72);
        pBVar51 = pBVar51 + 10;
        lVar39 = lVar39 + -1;
      } while (lVar39 != 0);
    }
    auVar72 = vmovshdup_avx(auVar73);
    auVar72 = vcmpps_avx(auVar72,ZEXT416((uint)BStack_1898.upper),1);
    auVar73 = vcmpps_avx(ZEXT416((uint)BStack_1898.lower),auVar73,1);
    auVar73 = vorps_avx(auVar73,auVar72);
    bVar64 = auVar73[0] & 1;
  }
  else {
    bVar64 = 0;
  }
  local_1a88.lower = (float)(undefined4)local_1f20._end;
  local_1a88.upper = (float)local_1f20._end._4_4_;
  local_1d78.lower = (float)(undefined4)local_1f20._begin;
  local_1d78.upper = (float)local_1f20._begin._4_4_;
  local_1e38 = local_1f20._end - local_1f20._begin;
  local_1f28 = this;
  BStack_1898 = BVar34;
  if (((local_1e38 <= (this->cfg).maxLeafSize) &&
      (uStack_1878._4_4_ = (uint)((ulong)lStack_1238 >> 0x20), uStack_1878._4_4_ < 2)) &&
     (bVar64 == 0)) {
    local_1ec8 = *(PrimRefMB **)((long)BVar40 + 0x20);
    local_1d60._0_4_ = local_1ec8[local_1f20._begin].lbounds.bounds0.lower.field_0.m128[3];
    uVar37 = 1;
    if (1 < local_1e38) {
      uVar68 = 1;
      do {
        fVar4 = local_1ec8[local_1f20._begin + uVar68].lbounds.bounds0.lower.field_0.m128[3];
        uVar42 = (ulong)uVar37;
        if (uVar37 != 0) {
          uVar58 = 0;
          do {
            if (fVar4 == *(float *)(local_1d60 + uVar58 * 4)) goto LAB_0145e72e;
            uVar58 = uVar58 + 1;
          } while (uVar42 != uVar58);
        }
        uVar37 = uVar37 + 1;
        *(float *)(local_1d60 + uVar42 * 4) = fVar4;
LAB_0145e72e:
        uVar68 = uVar68 + 1;
      } while (uVar68 != local_1e38);
    }
    local_1d80 = (ulong)uVar37;
    local_1bc8._8_8_ = (task_group_context *)((ulong)uVar37 * 0x90);
    BVar40 = (BBox1f)(alloc.talloc1)->parent;
    local_1f20 = rVar29;
    _local_1ee0 = auVar71;
    if (alloc.alloc != (((atomic<embree::FastAllocator_*> *)((long)BVar40 + 8))->_M_b)._M_p) {
      sStack_1838 = CONCAT71(sStack_1838._1_7_,1);
      local_1840 = BVar40;
      MutexSys::lock((MutexSys *)BVar40);
      if ((((atomic<embree::FastAllocator_*> *)((long)BVar40 + 8))->_M_b)._M_p !=
          (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)((long)BVar40 + 8))->_M_b)._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)((long)BVar40 + 0xa8) + (long)*(void **)((long)BVar40 + 0x68);
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)((long)BVar40 + 8))->_M_b)._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((long)*(void **)((long)BVar40 + 0x58) + (long)*(void **)((long)BVar40 + 0x98)) -
             ((long)*(void **)((long)BVar40 + 0x50) + (long)*(void **)((long)BVar40 + 0x90)));
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)((long)BVar40 + 8))->_M_b)._M_p)->
                  bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (long)*(void **)((long)BVar40 + 0xb0) + (long)*(void **)((long)BVar40 + 0x70);
        UNLOCK();
      }
      auVar71 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])((long)BVar40 + 0x58) = ZEXT1632(auVar71);
      *(undefined1 (*) [32])((long)BVar40 + 0x48) = ZEXT1632(auVar71);
      auVar78 = ZEXT1632(auVar71);
      if (alloc.alloc == (FastAllocator *)0x0) {
        *(undefined1 (*) [32])((long)BVar40 + 0x98) = auVar78;
        *(undefined1 (*) [32])((long)BVar40 + 0x88) = auVar78;
      }
      else {
        *(void **)((long)BVar40 + 0x60) = (void *)(alloc.alloc)->defaultBlockSize;
        *(undefined1 (*) [32])((long)BVar40 + 0x88) = auVar78;
        *(undefined1 (*) [32])((long)BVar40 + 0x98) = auVar78;
        *(void **)((long)BVar40 + 0xa0) = (void *)(alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (((atomic<embree::FastAllocator_*> *)((long)BVar40 + 8))->_M_b)._M_p = alloc.alloc;
      UNLOCK();
      local_1240.my_parent = (task_group_context *)&FastAllocator::s_thread_local_allocators_lock;
      lStack_1238 = CONCAT71(lStack_1238._1_7_,1);
      local_1cd0._0_8_ = BVar40;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar13._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar13,(ThreadLocal2 **)local_1cd0);
      }
      else {
        *iVar13._M_current = (ThreadLocal2 *)local_1cd0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if ((char)lStack_1238 == '\x01') {
        MutexSys::unlock((MutexSys *)local_1240.my_parent);
      }
      if ((char)sStack_1838 == '\x01') {
        MutexSys::unlock((MutexSys *)local_1840);
      }
    }
    (alloc.talloc1)->bytesUsed = (size_t)(local_1bc8._8_8_ + (alloc.talloc1)->bytesUsed);
    sVar47 = (alloc.talloc1)->cur;
    uVar68 = (ulong)(-(int)sVar47 & 0xf);
    pcVar65 = (char *)(local_1bc8._8_8_ + uVar68 + sVar47);
    (alloc.talloc1)->cur = (size_t)pcVar65;
    if ((undefined1 *)(alloc.talloc1)->end < pcVar65) {
      (alloc.talloc1)->cur = sVar47;
      if ((alloc.talloc1)->allocBlockSize < (task_group_context *)(local_1bc8._8_8_ << 2)) {
        pcVar65 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)((long)&local_1bc8 + 8));
      }
      else {
        local_1240 = (anon_union_8_2_d71db6ad_for_task_group_context_11)
                     (alloc.talloc1)->allocBlockSize;
        pcVar65 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1240);
        (alloc.talloc1)->ptr = pcVar65;
        sVar47 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar47;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = (size_t)local_1240;
        (alloc.talloc1)->cur = local_1bc8._8_8_;
        if (local_1240.my_parent < (ulong)local_1bc8._8_8_) {
          (alloc.talloc1)->cur = 0;
          local_1240 = (anon_union_8_2_d71db6ad_for_task_group_context_11)
                       (alloc.talloc1)->allocBlockSize;
          pcVar65 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1240);
          (alloc.talloc1)->ptr = pcVar65;
          sVar47 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar47;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = (size_t)local_1240;
          (alloc.talloc1)->cur = local_1bc8._8_8_;
          if (local_1240.my_parent < (ulong)local_1bc8._8_8_) {
            (alloc.talloc1)->cur = 0;
            pcVar65 = (char *)0x0;
            this = local_1f28;
            goto LAB_0145f0aa;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar47;
        this = local_1f28;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar68;
      pcVar65 = (alloc.talloc1)->ptr + ((long)pcVar65 - local_1bc8._8_8_);
    }
LAB_0145f0aa:
    uVar68 = 7;
    if (local_1d80 < 7) {
      uVar68 = local_1d80;
    }
    local_1a90 = uVar68 | (ulong)pcVar65 | 8;
    if (local_1d80 == 0) {
      auVar162._8_4_ = 0xff800000;
      auVar162._0_8_ = 0xff800000ff800000;
      auVar162._12_4_ = 0xff800000;
      local_1ec0._8_4_ = 0x7f800000;
      local_1ec0._0_8_ = 0x7f8000007f800000;
      local_1ec0._12_4_ = 0x7f800000;
      local_1e60._8_4_ = 0x7f800000;
      local_1e60._0_8_ = 0x7f8000007f800000;
      local_1e60._12_4_ = 0x7f800000;
      local_1e50 = auVar162;
    }
    else {
      local_1e50._8_4_ = 0xff800000;
      local_1e50._0_8_ = 0xff800000ff800000;
      local_1e50._12_4_ = 0xff800000;
      auVar71 = ZEXT816(0) << 0x40;
      auVar168._8_4_ = 0xddccb9a2;
      auVar168._0_8_ = 0xddccb9a2ddccb9a2;
      auVar168._12_4_ = 0xddccb9a2;
      auVar102._8_4_ = 0x5dccb9a2;
      auVar102._0_8_ = 0x5dccb9a25dccb9a2;
      auVar102._12_4_ = 0x5dccb9a2;
      local_1e60._8_4_ = 0x7f800000;
      local_1e60._0_8_ = 0x7f8000007f800000;
      local_1e60._12_4_ = 0x7f800000;
      auVar163 = ZEXT1664(local_1e50);
      local_1ec0._8_4_ = 0x7f800000;
      local_1ec0._0_8_ = 0x7f8000007f800000;
      local_1ec0._12_4_ = 0x7f800000;
      local_1d70 = pcVar65;
      local_1d68 = 0;
      do {
        auVar142 = ZEXT1664(auVar71);
        uVar37 = *(uint *)(local_1d60 + local_1d68 * 4);
        uVar68 = (ulong)uVar37;
        if (local_1a88 == local_1d78) {
          uVar58 = 0;
        }
        else {
          pGVar15 = (((this->createLeaf).scene)->geometries).items[uVar68].ptr;
          local_1a80 = (this->createLeaf).sgrids;
          fVar4 = BStack_1898.lower;
          fVar18 = BStack_1898.upper;
          uVar42 = 0;
          uVar58 = 0;
          local_1a70 = pcVar65;
          local_1a78 = uVar68;
          do {
            pSVar30 = local_1a80;
            if (local_1ec8[uVar57 + uVar42].lbounds.bounds0.lower.field_0.m128[3] == (float)uVar68)
            {
              local_1ad0 = auVar163._0_16_;
              fVar115 = local_1ec8[uVar57 + uVar42].lbounds.bounds0.upper.field_0.m128[3];
              uVar5 = local_1a80[(uint)fVar115].sx;
              *(uint *)((long)&local_1e10 + uVar58 * 4) = (uint)uVar5;
              uVar56 = pSVar30[(uint)fVar115].sy;
              *(uint *)(local_1a50 + uVar58 * 4 + 0x10) = (uint)uVar56;
              uVar37 = pSVar30[(uint)fVar115].primID;
              *(uint *)(local_19b0 + uVar58 * 4) = uVar37;
              uVar68 = (ulong)uVar5 & 0x7fff;
              uVar60 = (ulong)uVar56 & 0x7fff;
              lVar39 = *(long *)&pGVar15->field_0x58;
              lVar44 = (ulong)uVar37 *
                       pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
              fVar115 = pGVar15->fnumTimeSegments;
              fVar79 = (pGVar15->time_range).lower;
              fVar133 = (pGVar15->time_range).upper - fVar79;
              fVar103 = (fVar4 - fVar79) / fVar133;
              fVar133 = (fVar18 - fVar79) / fVar133;
              fVar79 = fVar115 * fVar103;
              fVar80 = fVar115 * fVar133;
              auVar73 = vroundss_avx(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79),9);
              auVar72 = vroundss_avx(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80),10);
              auVar71 = vmaxss_avx(auVar73,ZEXT416(0));
              iVar7 = (int)auVar73._0_4_;
              if ((int)auVar73._0_4_ < 0) {
                iVar7 = -1;
              }
              iVar50 = (int)fVar115 + 1;
              if ((int)auVar72._0_4_ < (int)fVar115 + 1) {
                iVar50 = (int)auVar72._0_4_;
              }
              uVar5 = *(ushort *)(lVar39 + 10 + lVar44);
              uVar66 = (ulong)uVar5;
              if (uVar60 + 3 < (ulong)uVar5) {
                uVar66 = uVar60 + 3;
              }
              iVar38 = (int)auVar71._0_4_;
              auVar76._8_4_ = 0x7f800000;
              auVar76._0_8_ = 0x7f8000007f800000;
              auVar76._12_4_ = 0x7f800000;
              auVar88._8_4_ = 0xff800000;
              auVar88._0_8_ = 0xff800000ff800000;
              auVar88._12_4_ = 0xff800000;
              uVar59 = (ushort)uVar60;
              uVar56 = (ushort)uVar68;
              if (uVar59 < uVar5) {
                uVar6 = *(ushort *)(lVar39 + 8 + lVar44);
                uVar46 = (ulong)uVar6;
                if (uVar68 + 3 < (ulong)uVar6) {
                  uVar46 = uVar68 + 3;
                }
                bVar69 = true;
                auVar163 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
                auVar142 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                uVar54 = uVar60;
                do {
                  if (uVar56 < uVar6) {
                    lVar67 = (long)iVar38 * 0x38;
                    lVar55 = *(long *)(*(long *)&pGVar15[2].numPrimitives + 0x10 + lVar67);
                    pauVar45 = (undefined1 (*) [16])
                               ((*(uint *)(lVar39 + lVar44) + uVar68 +
                                *(uint *)(lVar39 + 4 + lVar44) * uVar54) * lVar55 +
                               *(long *)(*(long *)&pGVar15[2].numPrimitives + lVar67));
                    lVar67 = uVar46 - uVar68;
                    do {
                      auVar73 = *pauVar45;
                      auVar85 = vcmpps_avx(auVar73,auVar168,6);
                      auVar99 = vcmpps_avx(auVar73,auVar102,1);
                      auVar85 = vandps_avx(auVar85,auVar99);
                      uVar63 = vmovmskps_avx(auVar85);
                      if ((~(byte)uVar63 & 7) != 0) {
                        auVar76._8_4_ = 0x7f800000;
                        auVar76._0_8_ = 0x7f8000007f800000;
                        auVar76._12_4_ = 0x7f800000;
                        auVar88._8_4_ = 0xff800000;
                        auVar88._0_8_ = 0xff800000ff800000;
                        auVar88._12_4_ = 0xff800000;
                        if (!bVar69) {
                          auVar76 = auVar142._0_16_;
                          auVar88 = auVar163._0_16_;
                        }
                        goto LAB_0145fd58;
                      }
                      auVar85 = vminps_avx(auVar142._0_16_,auVar73);
                      auVar142 = ZEXT1664(auVar85);
                      auVar73 = vmaxps_avx(auVar163._0_16_,auVar73);
                      auVar163 = ZEXT1664(auVar73);
                      pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar55);
                      lVar67 = lVar67 + -1;
                    } while (lVar67 != 0);
                  }
                  uVar54 = uVar54 + 1;
                  bVar69 = uVar54 < uVar66;
                  auVar76 = auVar142._0_16_;
                  auVar88 = auVar163._0_16_;
                } while (uVar54 != uVar66);
              }
LAB_0145fd58:
              auVar73 = vminss_avx(auVar72,ZEXT416((uint)fVar115));
              fVar82 = auVar73._0_4_;
              auVar145._8_4_ = 0x7f800000;
              auVar145._0_8_ = 0x7f8000007f800000;
              auVar145._12_4_ = 0x7f800000;
              auVar131._8_4_ = 0xff800000;
              auVar131._0_8_ = 0xff800000ff800000;
              auVar131._12_4_ = 0xff800000;
              if (uVar59 < uVar5) {
                uVar6 = *(ushort *)(lVar39 + 8 + lVar44);
                uVar46 = (ulong)uVar6;
                if (uVar68 + 3 < (ulong)uVar6) {
                  uVar46 = uVar68 + 3;
                }
                bVar69 = true;
                lVar55 = (long)(int)fVar82 * 0x38;
                auVar163 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
                auVar142 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                uVar54 = uVar60;
                do {
                  if (uVar56 < uVar6) {
                    lVar67 = *(long *)(*(long *)&pGVar15[2].numPrimitives + 0x10 + lVar55);
                    pauVar45 = (undefined1 (*) [16])
                               ((*(uint *)(lVar39 + lVar44) + uVar68 +
                                *(uint *)(lVar39 + 4 + lVar44) * uVar54) * lVar67 +
                               *(long *)(*(long *)&pGVar15[2].numPrimitives + lVar55));
                    lVar62 = uVar46 - uVar68;
                    do {
                      auVar73 = *pauVar45;
                      auVar72 = vcmpps_avx(auVar73,auVar168,6);
                      auVar85 = vcmpps_avx(auVar73,auVar102,1);
                      auVar72 = vandps_avx(auVar85,auVar72);
                      uVar63 = vmovmskps_avx(auVar72);
                      if ((~(byte)uVar63 & 7) != 0) {
                        auVar145._8_4_ = 0x7f800000;
                        auVar145._0_8_ = 0x7f8000007f800000;
                        auVar145._12_4_ = 0x7f800000;
                        auVar131._8_4_ = 0xff800000;
                        auVar131._0_8_ = 0xff800000ff800000;
                        auVar131._12_4_ = 0xff800000;
                        if (!bVar69) {
                          auVar145 = auVar142._0_16_;
                          auVar131 = auVar163._0_16_;
                        }
                        goto LAB_0145fe4c;
                      }
                      auVar72 = vminps_avx(auVar142._0_16_,auVar73);
                      auVar142 = ZEXT1664(auVar72);
                      auVar73 = vmaxps_avx(auVar163._0_16_,auVar73);
                      auVar163 = ZEXT1664(auVar73);
                      pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar67);
                      lVar62 = lVar62 + -1;
                    } while (lVar62 != 0);
                  }
                  uVar54 = uVar54 + 1;
                  bVar69 = uVar54 < uVar66;
                  auVar145 = auVar142._0_16_;
                  auVar131 = auVar163._0_16_;
                } while (uVar54 != uVar66);
              }
LAB_0145fe4c:
              auVar71 = ZEXT416((uint)(fVar79 - auVar71._0_4_));
              fVar143 = auVar145._0_4_;
              fVar147 = auVar145._4_4_;
              fVar148 = auVar145._8_4_;
              fVar149 = auVar145._12_4_;
              fVar96 = auVar76._4_4_;
              fVar98 = auVar76._8_4_;
              fVar16 = auVar76._12_4_;
              fVar92 = auVar131._4_4_;
              fVar159 = auVar131._8_4_;
              fVar161 = auVar131._12_4_;
              fVar97 = auVar88._4_4_;
              fVar160 = auVar88._8_4_;
              fVar17 = auVar88._12_4_;
              fVar91 = auVar76._0_4_;
              fVar90 = auVar131._0_4_;
              fVar79 = auVar88._0_4_;
              if (iVar50 - iVar7 == 1) {
                auVar71 = vmaxss_avx(auVar71,ZEXT816(0) << 0x40);
                auVar73 = vshufps_avx(auVar71,auVar71,0);
                auVar71 = ZEXT416((uint)(1.0 - auVar71._0_4_));
                auVar71 = vshufps_avx(auVar71,auVar71,0);
                auVar95._0_4_ = auVar71._0_4_ * fVar91 + fVar143 * auVar73._0_4_;
                auVar95._4_4_ = auVar71._4_4_ * fVar96 + fVar147 * auVar73._4_4_;
                auVar95._8_4_ = auVar71._8_4_ * fVar98 + fVar148 * auVar73._8_4_;
                auVar95._12_4_ = auVar71._12_4_ * fVar16 + fVar149 * auVar73._12_4_;
                auVar142 = ZEXT464(0) << 0x20;
                aVar158._0_4_ = auVar71._0_4_ * fVar79 + auVar73._0_4_ * fVar90;
                aVar158._4_4_ = auVar71._4_4_ * fVar97 + auVar73._4_4_ * fVar92;
                aVar158._8_4_ = auVar71._8_4_ * fVar160 + auVar73._8_4_ * fVar159;
                aVar158._12_4_ = auVar71._12_4_ * fVar17 + auVar73._12_4_ * fVar161;
                auVar71 = vmaxss_avx(ZEXT416((uint)(fVar82 - fVar80)),ZEXT816(0) << 0x40);
                auVar73 = vshufps_avx(auVar71,auVar71,0);
                auVar71 = ZEXT416((uint)(1.0 - auVar71._0_4_));
                auVar71 = vshufps_avx(auVar71,auVar71,0);
                auVar77._0_4_ = auVar73._0_4_ * fVar91 + fVar143 * auVar71._0_4_;
                auVar77._4_4_ = auVar73._4_4_ * fVar96 + fVar147 * auVar71._4_4_;
                auVar77._8_4_ = auVar73._8_4_ * fVar98 + fVar148 * auVar71._8_4_;
                auVar77._12_4_ = auVar73._12_4_ * fVar16 + fVar149 * auVar71._12_4_;
                auVar89._0_4_ = auVar73._0_4_ * fVar79 + auVar71._0_4_ * fVar90;
                auVar89._4_4_ = auVar73._4_4_ * fVar97 + auVar71._4_4_ * fVar92;
                auVar89._8_4_ = auVar73._8_4_ * fVar160 + auVar71._8_4_ * fVar159;
                auVar89._12_4_ = auVar73._12_4_ * fVar17 + auVar71._12_4_ * fVar161;
              }
              else {
                auVar155._8_4_ = 0x7f800000;
                auVar155._0_8_ = 0x7f8000007f800000;
                auVar155._12_4_ = 0x7f800000;
                auVar167._8_4_ = 0xff800000;
                auVar167._0_8_ = 0xff800000ff800000;
                auVar167._12_4_ = 0xff800000;
                if (uVar59 < uVar5) {
                  uVar6 = *(ushort *)(lVar39 + 8 + lVar44);
                  uVar46 = (ulong)uVar6;
                  if (uVar68 + 3 < (ulong)uVar6) {
                    uVar46 = uVar68 + 3;
                  }
                  bVar69 = true;
                  lVar55 = (long)iVar38 * 0x38;
                  auVar163 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)))
                  ;
                  auVar142 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  uVar54 = uVar60;
                  do {
                    if (uVar56 < uVar6) {
                      lVar67 = *(long *)(*(long *)&pGVar15[2].numPrimitives + 0x48 + lVar55);
                      pauVar45 = (undefined1 (*) [16])
                                 ((*(uint *)(lVar39 + lVar44) + uVar68 +
                                  *(uint *)(lVar39 + 4 + lVar44) * uVar54) * lVar67 +
                                 *(long *)(*(long *)&pGVar15[2].numPrimitives + 0x38 + lVar55));
                      lVar62 = uVar46 - uVar68;
                      do {
                        auVar73 = *pauVar45;
                        auVar72 = vcmpps_avx(auVar73,auVar168,6);
                        auVar85 = vcmpps_avx(auVar73,auVar102,1);
                        auVar72 = vandps_avx(auVar72,auVar85);
                        uVar63 = vmovmskps_avx(auVar72);
                        if ((~(byte)uVar63 & 7) != 0) {
                          auVar155._8_4_ = 0x7f800000;
                          auVar155._0_8_ = 0x7f8000007f800000;
                          auVar155._12_4_ = 0x7f800000;
                          auVar167._8_4_ = 0xff800000;
                          auVar167._0_8_ = 0xff800000ff800000;
                          auVar167._12_4_ = 0xff800000;
                          if (!bVar69) {
                            auVar167 = auVar163._0_16_;
                            auVar155 = auVar142._0_16_;
                          }
                          goto LAB_0145ffc2;
                        }
                        auVar72 = vminps_avx(auVar142._0_16_,auVar73);
                        auVar142 = ZEXT1664(auVar72);
                        auVar73 = vmaxps_avx(auVar163._0_16_,auVar73);
                        auVar163 = ZEXT1664(auVar73);
                        pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar67);
                        lVar62 = lVar62 + -1;
                      } while (lVar62 != 0);
                    }
                    uVar54 = uVar54 + 1;
                    bVar69 = uVar54 < uVar66;
                    auVar167 = auVar163._0_16_;
                    auVar155 = auVar142._0_16_;
                  } while (uVar54 != uVar66);
                }
LAB_0145ffc2:
                auVar165._8_4_ = 0x7f800000;
                auVar165._0_8_ = 0x7f8000007f800000;
                auVar165._12_4_ = 0x7f800000;
                auVar105._8_4_ = 0xff800000;
                auVar105._0_8_ = 0xff800000ff800000;
                auVar105._12_4_ = 0xff800000;
                if (uVar59 < uVar5) {
                  uVar6 = *(ushort *)(lVar39 + 8 + lVar44);
                  uVar46 = (ulong)uVar6;
                  if (uVar68 + 3 < (ulong)uVar6) {
                    uVar46 = uVar68 + 3;
                  }
                  bVar69 = true;
                  lVar55 = (long)(int)fVar82 * 0x38;
                  auVar163 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)))
                  ;
                  auVar142 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                  uVar54 = uVar60;
                  do {
                    if (uVar56 < uVar6) {
                      lVar67 = *(long *)(*(long *)&pGVar15[2].numPrimitives + -0x28 + lVar55);
                      pauVar45 = (undefined1 (*) [16])
                                 ((*(uint *)(lVar39 + lVar44) + uVar68 +
                                  *(uint *)(lVar39 + 4 + lVar44) * uVar54) * lVar67 +
                                 *(long *)(*(long *)&pGVar15[2].numPrimitives + -0x38 + lVar55));
                      lVar62 = uVar46 - uVar68;
                      do {
                        auVar73 = *pauVar45;
                        auVar72 = vcmpps_avx(auVar73,auVar168,6);
                        auVar85 = vcmpps_avx(auVar73,auVar102,1);
                        auVar72 = vandps_avx(auVar72,auVar85);
                        uVar63 = vmovmskps_avx(auVar72);
                        if ((~(byte)uVar63 & 7) != 0) {
                          auVar165._8_4_ = 0x7f800000;
                          auVar165._0_8_ = 0x7f8000007f800000;
                          auVar165._12_4_ = 0x7f800000;
                          auVar105._8_4_ = 0xff800000;
                          auVar105._0_8_ = 0xff800000ff800000;
                          auVar105._12_4_ = 0xff800000;
                          if (!bVar69) {
                            auVar105 = auVar163._0_16_;
                            auVar165 = auVar142._0_16_;
                          }
                          goto LAB_014600ac;
                        }
                        auVar72 = vminps_avx(auVar142._0_16_,auVar73);
                        auVar142 = ZEXT1664(auVar72);
                        auVar73 = vmaxps_avx(auVar163._0_16_,auVar73);
                        auVar163 = ZEXT1664(auVar73);
                        pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar67);
                        lVar62 = lVar62 + -1;
                      } while (lVar62 != 0);
                    }
                    uVar54 = uVar54 + 1;
                    bVar69 = uVar54 < uVar66;
                    auVar105 = auVar163._0_16_;
                    auVar165 = auVar142._0_16_;
                  } while (uVar54 != uVar66);
                }
LAB_014600ac:
                auVar71 = vmaxss_avx(auVar71,ZEXT416(0) << 0x20);
                auVar73 = vshufps_avx(auVar71,auVar71,0);
                auVar71 = ZEXT416((uint)(1.0 - auVar71._0_4_));
                auVar71 = vshufps_avx(auVar71,auVar71,0);
                auVar95._0_4_ = auVar71._0_4_ * fVar91 + auVar155._0_4_ * auVar73._0_4_;
                auVar95._4_4_ = auVar71._4_4_ * fVar96 + auVar155._4_4_ * auVar73._4_4_;
                auVar95._8_4_ = auVar71._8_4_ * fVar98 + auVar155._8_4_ * auVar73._8_4_;
                auVar95._12_4_ = auVar71._12_4_ * fVar16 + auVar155._12_4_ * auVar73._12_4_;
                aVar158._0_4_ = auVar71._0_4_ * fVar79 + auVar167._0_4_ * auVar73._0_4_;
                aVar158._4_4_ = auVar71._4_4_ * fVar97 + auVar167._4_4_ * auVar73._4_4_;
                aVar158._8_4_ = auVar71._8_4_ * fVar160 + auVar167._8_4_ * auVar73._8_4_;
                aVar158._12_4_ = auVar71._12_4_ * fVar17 + auVar167._12_4_ * auVar73._12_4_;
                auVar71 = vmaxss_avx(ZEXT416((uint)(fVar82 - fVar80)),ZEXT416(0) << 0x20);
                auVar73 = vshufps_avx(auVar71,auVar71,0);
                auVar71 = ZEXT416((uint)(1.0 - auVar71._0_4_));
                auVar71 = vshufps_avx(auVar71,auVar71,0);
                auVar77._0_4_ = fVar143 * auVar71._0_4_ + auVar165._0_4_ * auVar73._0_4_;
                auVar77._4_4_ = fVar147 * auVar71._4_4_ + auVar165._4_4_ * auVar73._4_4_;
                auVar77._8_4_ = fVar148 * auVar71._8_4_ + auVar165._8_4_ * auVar73._8_4_;
                auVar77._12_4_ = fVar149 * auVar71._12_4_ + auVar165._12_4_ * auVar73._12_4_;
                auVar89._0_4_ = auVar71._0_4_ * fVar90 + auVar73._0_4_ * auVar105._0_4_;
                auVar89._4_4_ = auVar71._4_4_ * fVar92 + auVar73._4_4_ * auVar105._4_4_;
                auVar89._8_4_ = auVar71._8_4_ * fVar159 + auVar73._8_4_ * auVar105._8_4_;
                auVar89._12_4_ = auVar71._12_4_ * fVar161 + auVar73._12_4_ * auVar105._12_4_;
                if ((int)(iVar7 + 1U) < iVar50) {
                  uVar46 = (ulong)(iVar7 + 1U);
                  auVar142 = ZEXT864(0) << 0x40;
                  do {
                    auVar132._8_4_ = 0x7f800000;
                    auVar132._0_8_ = 0x7f8000007f800000;
                    auVar132._12_4_ = 0x7f800000;
                    auVar146._8_4_ = 0xff800000;
                    auVar146._0_8_ = 0xff800000ff800000;
                    auVar146._12_4_ = 0xff800000;
                    if (uVar59 < uVar5) {
                      uVar6 = *(ushort *)(lVar39 + 8 + lVar44);
                      uVar54 = (ulong)uVar6;
                      if (uVar68 + 3 < (ulong)uVar6) {
                        uVar54 = uVar68 + 3;
                      }
                      bVar69 = true;
                      auVar163 = ZEXT1664(CONCAT412(0xff800000,
                                                    CONCAT48(0xff800000,0xff800000ff800000)));
                      auVar124 = ZEXT1664(CONCAT412(0x7f800000,
                                                    CONCAT48(0x7f800000,0x7f8000007f800000)));
                      uVar61 = uVar60;
                      do {
                        if (uVar56 < uVar6) {
                          lVar55 = *(long *)(*(long *)&pGVar15[2].numPrimitives + 0x10 +
                                            uVar46 * 0x38);
                          pauVar45 = (undefined1 (*) [16])
                                     ((*(uint *)(lVar39 + lVar44) + uVar68 +
                                      *(uint *)(lVar39 + 4 + lVar44) * uVar61) * lVar55 +
                                     *(long *)(*(long *)&pGVar15[2].numPrimitives + uVar46 * 0x38));
                          lVar67 = uVar54 - uVar68;
                          do {
                            auVar71 = *pauVar45;
                            auVar73 = vcmpps_avx(auVar71,auVar168,6);
                            auVar72 = vcmpps_avx(auVar71,auVar102,1);
                            auVar73 = vandps_avx(auVar73,auVar72);
                            uVar63 = vmovmskps_avx(auVar73);
                            if ((~(byte)uVar63 & 7) != 0) {
                              auVar132._8_4_ = 0x7f800000;
                              auVar132._0_8_ = 0x7f8000007f800000;
                              auVar132._12_4_ = 0x7f800000;
                              auVar146._8_4_ = 0xff800000;
                              auVar146._0_8_ = 0xff800000ff800000;
                              auVar146._12_4_ = 0xff800000;
                              if (!bVar69) {
                                auVar132 = auVar124._0_16_;
                                auVar146 = auVar163._0_16_;
                              }
                              goto LAB_0146024f;
                            }
                            auVar73 = vminps_avx(auVar124._0_16_,auVar71);
                            auVar124 = ZEXT1664(auVar73);
                            auVar71 = vmaxps_avx(auVar163._0_16_,auVar71);
                            auVar163 = ZEXT1664(auVar71);
                            pauVar45 = (undefined1 (*) [16])(*pauVar45 + lVar55);
                            lVar67 = lVar67 + -1;
                          } while (lVar67 != 0);
                        }
                        uVar61 = uVar61 + 1;
                        bVar69 = uVar61 < uVar66;
                        auVar132 = auVar124._0_16_;
                        auVar146 = auVar163._0_16_;
                      } while (uVar61 != uVar66);
                    }
LAB_0146024f:
                    auVar113._0_4_ = ((float)(int)uVar46 / fVar115 - fVar103) / (fVar133 - fVar103);
                    auVar113._4_12_ = SUB6012((undefined1  [60])0x0,0);
                    auVar71 = vshufps_avx(auVar113,auVar113,0);
                    fVar79 = auVar77._4_4_;
                    fVar80 = auVar77._8_4_;
                    fVar82 = auVar77._12_4_;
                    auVar73 = vshufps_avx(ZEXT416((uint)(1.0 - auVar113._0_4_)),
                                          ZEXT416((uint)(1.0 - auVar113._0_4_)),0);
                    fVar96 = auVar95._4_4_;
                    fVar97 = auVar95._8_4_;
                    fVar98 = auVar95._12_4_;
                    auVar156._0_4_ = auVar77._0_4_ * auVar71._0_4_ + auVar95._0_4_ * auVar73._0_4_;
                    auVar156._4_4_ = fVar79 * auVar71._4_4_ + fVar96 * auVar73._4_4_;
                    auVar156._8_4_ = fVar80 * auVar71._8_4_ + fVar97 * auVar73._8_4_;
                    auVar156._12_4_ = fVar82 * auVar71._12_4_ + fVar98 * auVar73._12_4_;
                    auVar72 = vsubps_avx(auVar132,auVar156);
                    fVar90 = auVar89._4_4_;
                    fVar91 = auVar89._8_4_;
                    fVar92 = auVar89._12_4_;
                    fVar159 = aVar158.m128[1];
                    fVar160 = aVar158.m128[2];
                    fVar161 = aVar158.m128[3];
                    auVar114._0_4_ = auVar89._0_4_ * auVar71._0_4_ + aVar158.m128[0] * auVar73._0_4_
                    ;
                    auVar114._4_4_ = fVar90 * auVar71._4_4_ + fVar159 * auVar73._4_4_;
                    auVar114._8_4_ = fVar91 * auVar71._8_4_ + fVar160 * auVar73._8_4_;
                    auVar114._12_4_ = fVar92 * auVar71._12_4_ + fVar161 * auVar73._12_4_;
                    auVar71 = vsubps_avx(auVar146,auVar114);
                    auVar73 = vminps_avx(auVar72,ZEXT816(0) << 0x40);
                    auVar71 = vmaxps_avx(auVar71,ZEXT816(0) << 0x40);
                    auVar95._0_4_ = auVar95._0_4_ + auVar73._0_4_;
                    auVar95._4_4_ = fVar96 + auVar73._4_4_;
                    auVar95._8_4_ = fVar97 + auVar73._8_4_;
                    auVar95._12_4_ = fVar98 + auVar73._12_4_;
                    auVar77._0_4_ = auVar77._0_4_ + auVar73._0_4_;
                    auVar77._4_4_ = fVar79 + auVar73._4_4_;
                    auVar77._8_4_ = fVar80 + auVar73._8_4_;
                    auVar77._12_4_ = fVar82 + auVar73._12_4_;
                    aVar158._0_4_ = aVar158.m128[0] + auVar71._0_4_;
                    aVar158._4_4_ = fVar159 + auVar71._4_4_;
                    aVar158._8_4_ = fVar160 + auVar71._8_4_;
                    aVar158._12_4_ = fVar161 + auVar71._12_4_;
                    auVar89._0_4_ = auVar89._0_4_ + auVar71._0_4_;
                    auVar89._4_4_ = fVar90 + auVar71._4_4_;
                    auVar89._8_4_ = fVar91 + auVar71._8_4_;
                    auVar89._12_4_ = fVar92 + auVar71._12_4_;
                    uVar46 = uVar46 + 1;
                  } while (iVar50 != (int)uVar46);
                }
                else {
                  auVar142 = ZEXT864(0) << 0x40;
                }
              }
              local_1ec0 = vminps_avx(local_1ec0,auVar95);
              auVar71 = vmaxps_avx(local_1ad0,(undefined1  [16])aVar158);
              auVar163 = ZEXT1664(auVar71);
              local_1e60 = vminps_avx(local_1e60,auVar77);
              local_1e50 = vmaxps_avx(local_1e50,auVar89);
              *(undefined1 (*) [16])(local_1cd0 + uVar58 * 0x20) = auVar95;
              local_1cc0[uVar58 * 2] = aVar158;
              *(undefined1 (*) [16])(auStack_1bb8 + (uVar58 * 8 + -2) * 4) = auVar77;
              *(undefined1 (*) [16])(auStack_1bb8 + uVar58 * 0x20 + 8) = auVar89;
              local_1e98._0_4_ = (int)uVar58;
              uVar58 = (ulong)((int)local_1e98 + 1);
              pcVar65 = local_1a70;
              uVar68 = local_1a78;
              this = local_1f28;
            }
            auVar71 = auVar142._0_16_;
            uVar37 = (uint)uVar68;
            uVar42 = uVar42 + 1;
          } while (uVar42 != local_1e38);
        }
        auVar162 = auVar163._0_16_;
        lVar39 = local_1d68 * 0x90;
        lVar44 = local_1d68 * 0x90;
        pcVar3 = local_1d70 + lVar44;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3[4] = -1;
        pcVar3[5] = -1;
        pcVar3[6] = -1;
        pcVar3[7] = -1;
        pcVar3[8] = '\0';
        pcVar3[9] = '\0';
        pcVar3[10] = '\0';
        pcVar3[0xb] = '\0';
        pcVar3[0xc] = -1;
        pcVar3[0xd] = -1;
        pcVar3[0xe] = -1;
        pcVar3[0xf] = -1;
        pcVar3[0x10] = '\0';
        pcVar3[0x11] = '\0';
        pcVar3[0x12] = '\0';
        pcVar3[0x13] = '\0';
        pcVar3[0x14] = -1;
        pcVar3[0x15] = -1;
        pcVar3[0x16] = -1;
        pcVar3[0x17] = -1;
        pcVar3[0x18] = '\0';
        pcVar3[0x19] = '\0';
        pcVar3[0x1a] = '\0';
        pcVar3[0x1b] = '\0';
        pcVar3[0x1c] = -1;
        pcVar3[0x1d] = -1;
        pcVar3[0x1e] = -1;
        pcVar3[0x1f] = -1;
        pcVar3 = local_1d70 + lVar39 + 0x20;
        pcVar3[0] = -1;
        pcVar3[1] = -1;
        pcVar3[2] = -1;
        pcVar3[3] = -1;
        pcVar3 = local_1d70 + lVar44 + 0x30;
        pcVar3[0] = -1;
        pcVar3[1] = -1;
        pcVar3[2] = -1;
        pcVar3[3] = -1;
        pcVar3 = local_1d70 + lVar44 + 0x28;
        pcVar3[0] = -1;
        pcVar3[1] = -1;
        pcVar3[2] = -1;
        pcVar3[3] = -1;
        pcVar3 = local_1d70 + lVar39 + 0x24;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3 = local_1d70 + lVar44 + 0x34;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3 = local_1d70 + lVar44 + 0x2c;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3 = local_1d70 + lVar39 + 0x50;
        pcVar3[0] = -1;
        pcVar3[1] = -1;
        pcVar3[2] = -1;
        pcVar3[3] = -1;
        pcVar3 = local_1d70 + lVar44 + 0x60;
        pcVar3[0] = -1;
        pcVar3[1] = -1;
        pcVar3[2] = -1;
        pcVar3[3] = -1;
        pcVar3 = local_1d70 + lVar44 + 0x58;
        pcVar3[0] = -1;
        pcVar3[1] = -1;
        pcVar3[2] = -1;
        pcVar3[3] = -1;
        pcVar3 = local_1d70 + lVar39 + 0x54;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3 = local_1d70 + lVar44 + 100;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3 = local_1d70 + lVar44 + 0x5c;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        *(uint *)(local_1d70 + lVar44 + 0x88) = uVar37;
        *(float *)(local_1d70 + lVar44 + 0x80) = BStack_1898.lower;
        *(float *)(local_1d70 + lVar44 + 0x84) = 1.0 / (BStack_1898.upper - BStack_1898.lower);
        local_11e0._8_4_ = 0x7f800000;
        local_11e0._0_8_ = 0x7f8000007f800000;
        uStack_11d4 = 0x7f800000;
        local_1200._8_4_ = 0x7f800000;
        local_1200._0_8_ = 0x7f8000007f800000;
        local_1200._12_4_ = 0x7f800000;
        local_1220.i[2] = 0x7f800000;
        local_1220._0_8_ = 0x7f8000007f800000;
        local_1220.i[3] = 0x7f800000;
        local_11d0.lower = -INFINITY;
        local_11d0.upper = -INFINITY;
        uStack_11c8 = 0xff800000;
        uStack_11c4 = 0xff800000;
        local_11f0._8_4_ = 0xff800000;
        local_11f0._0_8_ = 0xff800000ff800000;
        local_11f0._12_4_ = 0xff800000;
        aStack_1210.i[2] = 0xff800000;
        aStack_1210._0_8_ = 0xff800000ff800000;
        aStack_1210.i[3] = 0xff800000;
        local_1240 = (anon_union_8_2_d71db6ad_for_task_group_context_11)0x8;
        lStack_1238 = 8;
        aStack_1230 = (anon_union_8_2_d71db6ad_for_task_group_context_11)0x8;
        BStack_1228.lower = 1.12104e-44;
        BStack_1228.upper = 0.0;
        local_17e0[0] = 0x7f800000;
        local_17e0[1] = 0x7f800000;
        local_17e0[2] = 0x7f800000;
        local_17e0[3] = 0x7f800000;
        local_1820[8] = INFINITY;
        local_1820[9] = INFINITY;
        local_1820[10] = INFINITY;
        local_1820[0xb] = INFINITY;
        local_1820[0] = INFINITY;
        local_1820[1] = INFINITY;
        local_1820[2] = INFINITY;
        local_1820[3] = INFINITY;
        local_17e0[4] = 0xff800000;
        local_17e0[5] = 0xff800000;
        local_17e0[6] = 0xff800000;
        local_17e0[7] = 0xff800000;
        local_17f0.lower = -INFINITY;
        local_17f0.upper = -INFINITY;
        uStack_17e8 = 0xff800000;
        uStack_17e4 = 0xff800000;
        local_1820[4] = -INFINITY;
        local_1820[5] = -INFINITY;
        local_1820[6] = -INFINITY;
        local_1820[7] = -INFINITY;
        local_1840.lower = 1.12104e-44;
        local_1840.upper = 0.0;
        sStack_1838 = 8;
        BStack_1830.lower = 1.12104e-44;
        BStack_1830.upper = 0.0;
        BStack_1828.lower = 1.12104e-44;
        BStack_1828.upper = 0.0;
        if ((int)uVar58 != 0) {
          lVar39 = 0;
          do {
            *(ulong *)(pcVar65 + lVar39 * 2) =
                 CONCAT44(*(undefined4 *)(local_19b0 + lVar39),
                          *(int *)(local_1a50 + lVar39 + 0x10) << 0x10 |
                          (uint)*(ushort *)((long)&local_1e10 + lVar39));
            uVar63 = *(undefined4 *)(local_1cd0 + lVar39 * 8 + 4);
            *(undefined4 *)((long)&local_1220 + lVar39) = *(undefined4 *)(local_1cd0 + lVar39 * 8);
            *(undefined4 *)(local_1200 + lVar39) = uVar63;
            *(undefined4 *)(local_11e0 + lVar39) = *(undefined4 *)(local_1cd0 + lVar39 * 8 + 8);
            *(undefined4 *)((long)&aStack_1210 + lVar39) =
                 *(undefined4 *)((long)local_1cc0 + lVar39 * 8);
            *(undefined4 *)(local_11f0 + lVar39) =
                 *(undefined4 *)((long)local_1cc0 + lVar39 * 8 + 4);
            *(undefined4 *)((long)&local_11d0.lower + lVar39) =
                 *(undefined4 *)((long)local_1cc0 + lVar39 * 8 + 8);
            uVar63 = *(undefined4 *)(auStack_1bb8 + (lVar39 * 2 + -1) * 4);
            *(undefined4 *)((long)local_1820 + lVar39) =
                 *(undefined4 *)(auStack_1bb8 + (lVar39 * 2 + -2) * 4);
            *(undefined4 *)((long)local_1820 + lVar39 + 0x20) = uVar63;
            *(undefined4 *)((long)local_17e0 + lVar39) = *(undefined4 *)(auStack_1bb8 + lVar39 * 8);
            *(undefined4 *)((long)local_1820 + lVar39 + 0x10) =
                 *(undefined4 *)(auStack_1bb8 + lVar39 * 8 + 8);
            uVar63 = ((BBox1f *)&aStack_1ba8)[lVar39].lower;
            *(undefined4 *)((long)&local_17f0.lower + lVar39) = (&uStack_1bac)[lVar39 * 2];
            *(undefined4 *)((long)local_17e0 + lVar39 + 0x10) = uVar63;
            lVar39 = lVar39 + 4;
          } while (uVar58 << 2 != lVar39);
        }
        auVar73 = vshufps_avx((undefined1  [16])local_1220,(undefined1  [16])local_1220,0xb1);
        auVar73 = vminps_avx(auVar73,(undefined1  [16])local_1220);
        auVar72 = vshufpd_avx(auVar73,auVar73,1);
        auVar99 = vminps_avx(auVar72,auVar73);
        auVar73 = vshufps_avx((undefined1  [16])aStack_1210,(undefined1  [16])aStack_1210,0xb1);
        auVar73 = vmaxps_avx(auVar73,(undefined1  [16])aStack_1210);
        auVar72 = vshufpd_avx(auVar73,auVar73,1);
        auVar73 = vmaxss_avx(auVar72,auVar73);
        fVar4 = (auVar73._0_4_ - auVar99._0_4_) * 1.0000002;
        auVar73 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(fVar4 / 255.0)),0);
        auVar72 = vblendvps_avx(ZEXT416((uint)(fVar4 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar73
                               );
        auVar73 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar4),1);
        auVar73 = vandps_avx(auVar73,ZEXT416((uint)(255.0 / fVar4)));
        auVar74 = vshufps_avx(auVar99,auVar99,0);
        auVar93 = vsubps_avx((undefined1  [16])local_1220,auVar74);
        auVar85 = vshufps_avx(auVar73,auVar73,0);
        auVar125._0_4_ = auVar93._0_4_ * auVar85._0_4_;
        auVar125._4_4_ = auVar93._4_4_ * auVar85._4_4_;
        auVar125._8_4_ = auVar93._8_4_ * auVar85._8_4_;
        auVar125._12_4_ = auVar93._12_4_ * auVar85._12_4_;
        auVar73 = vroundps_avx(auVar125,1);
        auVar73 = vcvtps2dq_avx(auVar73);
        auVar93 = vpmaxsd_avx(auVar73,auVar71);
        auVar71 = vsubps_avx((undefined1  [16])aStack_1210,auVar74);
        auVar106._0_4_ = auVar71._0_4_ * auVar85._0_4_;
        auVar106._4_4_ = auVar71._4_4_ * auVar85._4_4_;
        auVar106._8_4_ = auVar71._8_4_ * auVar85._8_4_;
        auVar106._12_4_ = auVar71._12_4_ * auVar85._12_4_;
        auVar71 = vroundps_avx(auVar106,2);
        auVar71 = vcvtps2dq_avx(auVar71);
        auVar164._8_4_ = 0xff;
        auVar164._0_8_ = 0xff000000ff;
        auVar164._12_4_ = 0xff;
        auVar19 = vpminsd_avx(auVar71,auVar164);
        auVar71 = vcvtdq2ps_avx(auVar93);
        auVar86 = vshufps_avx(auVar72,auVar72,0);
        auVar85 = vcvtdq2ps_avx(auVar19);
        auVar157._8_4_ = 0x7f800000;
        auVar157._0_8_ = 0x7f8000007f800000;
        auVar157._12_4_ = 0x7f800000;
        auVar73 = vcmpps_avx(auVar157,(undefined1  [16])local_1220,4);
        auVar136._0_4_ = auVar86._0_4_ * auVar71._0_4_ + auVar74._0_4_;
        auVar136._4_4_ = auVar86._4_4_ * auVar71._4_4_ + auVar74._4_4_;
        auVar136._8_4_ = auVar86._8_4_ * auVar71._8_4_ + auVar74._8_4_;
        auVar136._12_4_ = auVar86._12_4_ * auVar71._12_4_ + auVar74._12_4_;
        auVar118._0_4_ = auVar86._0_4_ * auVar85._0_4_ + auVar74._0_4_;
        auVar118._4_4_ = auVar86._4_4_ * auVar85._4_4_ + auVar74._4_4_;
        auVar118._8_4_ = auVar86._8_4_ * auVar85._8_4_ + auVar74._8_4_;
        auVar118._12_4_ = auVar86._12_4_ * auVar85._12_4_ + auVar74._12_4_;
        auVar71 = vcmpps_avx(auVar136,(undefined1  [16])local_1220,6);
        auVar71 = vpaddd_avx(auVar93,auVar71);
        auVar85 = vpmaxsd_avx(auVar71,_DAT_01feba10);
        auVar71 = vcmpps_avx(auVar118,(undefined1  [16])aStack_1210,1);
        auVar71 = vpsubd_avx(auVar19,auVar71);
        auVar93 = vpminsd_avx(auVar71,auVar164);
        auVar71 = vblendvps_avx(auVar164,auVar85,auVar73);
        auVar85 = vpackusdw_avx(auVar71,auVar71);
        auVar71 = vandps_avx(auVar73,auVar93);
        auVar71 = vpackusdw_avx(auVar71,auVar71);
        auVar71 = vpackuswb_avx(auVar85,auVar71);
        auVar71 = vpshufd_avx(auVar71,0xd8);
        *(long *)(local_1d70 + lVar44 + 0x20) = auVar71._0_8_;
        *(float *)(local_1d70 + lVar44 + 0x38) = auVar99._0_4_;
        *(int *)(local_1d70 + lVar44 + 0x44) = auVar72._0_4_;
        auVar71 = vshufps_avx(local_1200,local_1200,0xb1);
        auVar71 = vminps_avx(auVar71,local_1200);
        auVar73 = vshufpd_avx(auVar71,auVar71,1);
        auVar99 = vminps_avx(auVar73,auVar71);
        auVar71 = vshufps_avx(local_11f0,local_11f0,0xb1);
        auVar71 = vmaxps_avx(auVar71,local_11f0);
        auVar73 = vshufpd_avx(auVar71,auVar71,1);
        auVar71 = vmaxss_avx(auVar73,auVar71);
        fVar4 = (auVar71._0_4_ - auVar99._0_4_) * 1.0000002;
        auVar71 = vcmpss_avx(ZEXT416((uint)(fVar4 / 255.0)),ZEXT816(0) << 0x20,0);
        auVar73 = vblendvps_avx(ZEXT416((uint)(fVar4 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar71
                               );
        auVar71 = vcmpss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)fVar4),1);
        auVar71 = vandps_avx(auVar71,ZEXT416((uint)(255.0 / fVar4)));
        auVar74 = vshufps_avx(auVar99,auVar99,0);
        auVar85 = vsubps_avx(local_1200,auVar74);
        auVar72 = vshufps_avx(auVar71,auVar71,0);
        auVar126._0_4_ = auVar85._0_4_ * auVar72._0_4_;
        auVar126._4_4_ = auVar85._4_4_ * auVar72._4_4_;
        auVar126._8_4_ = auVar85._8_4_ * auVar72._8_4_;
        auVar126._12_4_ = auVar85._12_4_ * auVar72._12_4_;
        auVar71 = vroundps_avx(auVar126,1);
        auVar71 = vcvtps2dq_avx(auVar71);
        auVar93 = vpmaxsd_avx(auVar71,_DAT_01feba10);
        auVar71 = vsubps_avx(local_11f0,auVar74);
        auVar107._0_4_ = auVar71._0_4_ * auVar72._0_4_;
        auVar107._4_4_ = auVar71._4_4_ * auVar72._4_4_;
        auVar107._8_4_ = auVar71._8_4_ * auVar72._8_4_;
        auVar107._12_4_ = auVar71._12_4_ * auVar72._12_4_;
        auVar71 = vroundps_avx(auVar107,2);
        auVar71 = vcvtps2dq_avx(auVar71);
        auVar19 = vpminsd_avx(auVar71,auVar164);
        auVar71 = vcvtdq2ps_avx(auVar93);
        auVar86 = vshufps_avx(auVar73,auVar73,0);
        auVar85 = vcvtdq2ps_avx(auVar19);
        auVar152._8_4_ = 0x7f800000;
        auVar152._0_8_ = 0x7f8000007f800000;
        auVar152._12_4_ = 0x7f800000;
        auVar72 = vcmpps_avx(auVar152,local_1200,4);
        auVar137._0_4_ = auVar86._0_4_ * auVar71._0_4_ + auVar74._0_4_;
        auVar137._4_4_ = auVar86._4_4_ * auVar71._4_4_ + auVar74._4_4_;
        auVar137._8_4_ = auVar86._8_4_ * auVar71._8_4_ + auVar74._8_4_;
        auVar137._12_4_ = auVar86._12_4_ * auVar71._12_4_ + auVar74._12_4_;
        auVar119._0_4_ = auVar86._0_4_ * auVar85._0_4_ + auVar74._0_4_;
        auVar119._4_4_ = auVar86._4_4_ * auVar85._4_4_ + auVar74._4_4_;
        auVar119._8_4_ = auVar86._8_4_ * auVar85._8_4_ + auVar74._8_4_;
        auVar119._12_4_ = auVar86._12_4_ * auVar85._12_4_ + auVar74._12_4_;
        auVar71 = vcmpps_avx(auVar137,local_1200,6);
        auVar71 = vpaddd_avx(auVar93,auVar71);
        auVar85 = vpmaxsd_avx(auVar71,_DAT_01feba10);
        auVar71 = vcmpps_avx(auVar119,local_11f0,1);
        auVar71 = vpsubd_avx(auVar19,auVar71);
        auVar93 = vpminsd_avx(auVar71,auVar164);
        auVar71 = vblendvps_avx(auVar164,auVar85,auVar72);
        auVar85 = vpackusdw_avx(auVar71,auVar71);
        auVar71 = vandps_avx(auVar72,auVar93);
        auVar71 = vpackusdw_avx(auVar71,auVar71);
        auVar71 = vpackuswb_avx(auVar85,auVar71);
        auVar71 = vpshufd_avx(auVar71,0xd8);
        *(long *)(local_1d70 + lVar44 + 0x28) = auVar71._0_8_;
        *(float *)(local_1d70 + lVar44 + 0x3c) = auVar99._0_4_;
        *(int *)(local_1d70 + lVar44 + 0x48) = auVar73._0_4_;
        auVar28._4_4_ = local_11d0.upper;
        auVar28._0_4_ = local_11d0.lower;
        auVar28._8_4_ = uStack_11c8;
        auVar28._12_4_ = uStack_11c4;
        auVar71 = vshufps_avx(_local_11e0,_local_11e0,0xb1);
        auVar71 = vminps_avx(auVar71,_local_11e0);
        auVar73 = vshufpd_avx(auVar71,auVar71,1);
        auVar99 = vminps_avx(auVar73,auVar71);
        auVar71 = vshufps_avx(auVar28,auVar28,0xb1);
        auVar71 = vmaxps_avx(auVar71,auVar28);
        auVar73 = vshufpd_avx(auVar71,auVar71,1);
        auVar71 = vmaxss_avx(auVar73,auVar71);
        fVar4 = (auVar71._0_4_ - auVar99._0_4_) * 1.0000002;
        auVar71 = vcmpss_avx(ZEXT416(0) << 0x20,ZEXT416((uint)(fVar4 / 255.0)),0);
        auVar73 = vblendvps_avx(ZEXT416((uint)(fVar4 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar71
                               );
        auVar71 = vcmpss_avx(ZEXT416(0) << 0x20,ZEXT416((uint)fVar4),1);
        auVar71 = vandps_avx(auVar71,ZEXT416((uint)(255.0 / fVar4)));
        auVar74 = vshufps_avx(auVar99,auVar99,0);
        auVar85 = vsubps_avx(_local_11e0,auVar74);
        auVar72 = vshufps_avx(auVar71,auVar71,0);
        auVar127._0_4_ = auVar85._0_4_ * auVar72._0_4_;
        auVar127._4_4_ = auVar85._4_4_ * auVar72._4_4_;
        auVar127._8_4_ = auVar85._8_4_ * auVar72._8_4_;
        auVar127._12_4_ = auVar85._12_4_ * auVar72._12_4_;
        auVar71 = vroundps_avx(auVar127,1);
        auVar71 = vcvtps2dq_avx(auVar71);
        auVar93 = vpmaxsd_avx(auVar71,_DAT_01feba10);
        auVar71 = vsubps_avx(auVar28,auVar74);
        auVar108._0_4_ = auVar71._0_4_ * auVar72._0_4_;
        auVar108._4_4_ = auVar71._4_4_ * auVar72._4_4_;
        auVar108._8_4_ = auVar71._8_4_ * auVar72._8_4_;
        auVar108._12_4_ = auVar71._12_4_ * auVar72._12_4_;
        auVar71 = vroundps_avx(auVar108,2);
        auVar71 = vcvtps2dq_avx(auVar71);
        auVar19 = vpminsd_avx(auVar71,auVar164);
        auVar71 = vcvtdq2ps_avx(auVar93);
        auVar86 = vshufps_avx(auVar73,auVar73,0);
        auVar85 = vcvtdq2ps_avx(auVar19);
        auVar153._8_4_ = 0x7f800000;
        auVar153._0_8_ = 0x7f8000007f800000;
        auVar153._12_4_ = 0x7f800000;
        auVar72 = vcmpps_avx(auVar153,_local_11e0,4);
        auVar138._0_4_ = auVar86._0_4_ * auVar71._0_4_ + auVar74._0_4_;
        auVar138._4_4_ = auVar86._4_4_ * auVar71._4_4_ + auVar74._4_4_;
        auVar138._8_4_ = auVar86._8_4_ * auVar71._8_4_ + auVar74._8_4_;
        auVar138._12_4_ = auVar86._12_4_ * auVar71._12_4_ + auVar74._12_4_;
        auVar120._0_4_ = auVar86._0_4_ * auVar85._0_4_ + auVar74._0_4_;
        auVar120._4_4_ = auVar86._4_4_ * auVar85._4_4_ + auVar74._4_4_;
        auVar120._8_4_ = auVar86._8_4_ * auVar85._8_4_ + auVar74._8_4_;
        auVar120._12_4_ = auVar86._12_4_ * auVar85._12_4_ + auVar74._12_4_;
        auVar71 = vcmpps_avx(auVar138,_local_11e0,6);
        auVar71 = vpaddd_avx(auVar93,auVar71);
        auVar85 = vpmaxsd_avx(auVar71,_DAT_01feba10);
        auVar71 = vcmpps_avx(auVar120,auVar28,1);
        auVar71 = vpsubd_avx(auVar19,auVar71);
        auVar93 = vpminsd_avx(auVar71,auVar164);
        auVar71 = vblendvps_avx(auVar164,auVar85,auVar72);
        auVar85 = vpackusdw_avx(auVar71,auVar71);
        auVar71 = vandps_avx(auVar72,auVar93);
        auVar71 = vpackusdw_avx(auVar71,auVar71);
        auVar71 = vpackuswb_avx(auVar85,auVar71);
        auVar71 = vpshufd_avx(auVar71,0xd8);
        *(long *)(local_1d70 + lVar44 + 0x30) = auVar71._0_8_;
        *(float *)(local_1d70 + lVar44 + 0x40) = auVar99._0_4_;
        *(int *)(local_1d70 + lVar44 + 0x4c) = auVar73._0_4_;
        auVar22._4_4_ = local_1820[1];
        auVar22._0_4_ = local_1820[0];
        auVar22._8_4_ = local_1820[2];
        auVar22._12_4_ = local_1820[3];
        auVar23._4_4_ = local_1820[5];
        auVar23._0_4_ = local_1820[4];
        auVar23._8_4_ = local_1820[6];
        auVar23._12_4_ = local_1820[7];
        auVar71 = vshufps_avx(auVar22,auVar22,0xb1);
        auVar71 = vminps_avx(auVar71,auVar22);
        auVar73 = vshufpd_avx(auVar71,auVar71,1);
        auVar99 = vminps_avx(auVar73,auVar71);
        auVar71 = vshufps_avx(auVar23,auVar23,0xb1);
        auVar71 = vmaxps_avx(auVar71,auVar23);
        auVar73 = vshufpd_avx(auVar71,auVar71,1);
        auVar71 = vmaxss_avx(auVar73,auVar71);
        fVar4 = (auVar71._0_4_ - auVar99._0_4_) * 1.0000002;
        auVar71 = vcmpss_avx(ZEXT416((uint)(fVar4 / 255.0)),ZEXT816(0) << 0x20,0);
        auVar73 = vblendvps_avx(ZEXT416((uint)(fVar4 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar71
                               );
        auVar71 = vcmpss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)fVar4),1);
        auVar71 = vandps_avx(auVar71,ZEXT416((uint)(255.0 / fVar4)));
        auVar74 = vshufps_avx(auVar99,auVar99,0);
        auVar85 = vsubps_avx(auVar22,auVar74);
        auVar72 = vshufps_avx(auVar71,auVar71,0);
        auVar128._0_4_ = auVar85._0_4_ * auVar72._0_4_;
        auVar128._4_4_ = auVar85._4_4_ * auVar72._4_4_;
        auVar128._8_4_ = auVar85._8_4_ * auVar72._8_4_;
        auVar128._12_4_ = auVar85._12_4_ * auVar72._12_4_;
        auVar71 = vroundps_avx(auVar128,1);
        auVar71 = vcvtps2dq_avx(auVar71);
        auVar93 = vpmaxsd_avx(auVar71,_DAT_01feba10);
        auVar71 = vsubps_avx(auVar23,auVar74);
        auVar109._0_4_ = auVar71._0_4_ * auVar72._0_4_;
        auVar109._4_4_ = auVar71._4_4_ * auVar72._4_4_;
        auVar109._8_4_ = auVar71._8_4_ * auVar72._8_4_;
        auVar109._12_4_ = auVar71._12_4_ * auVar72._12_4_;
        auVar71 = vroundps_avx(auVar109,2);
        auVar71 = vcvtps2dq_avx(auVar71);
        auVar19 = vpminsd_avx(auVar71,auVar164);
        auVar71 = vcvtdq2ps_avx(auVar93);
        auVar86 = vshufps_avx(auVar73,auVar73,0);
        auVar85 = vcvtdq2ps_avx(auVar19);
        auVar75._8_4_ = 0x7f800000;
        auVar75._0_8_ = 0x7f8000007f800000;
        auVar75._12_4_ = 0x7f800000;
        auVar72 = vcmpps_avx(auVar22,auVar75,4);
        auVar139._0_4_ = auVar86._0_4_ * auVar71._0_4_ + auVar74._0_4_;
        auVar139._4_4_ = auVar86._4_4_ * auVar71._4_4_ + auVar74._4_4_;
        auVar139._8_4_ = auVar86._8_4_ * auVar71._8_4_ + auVar74._8_4_;
        auVar139._12_4_ = auVar86._12_4_ * auVar71._12_4_ + auVar74._12_4_;
        auVar121._0_4_ = auVar86._0_4_ * auVar85._0_4_ + auVar74._0_4_;
        auVar121._4_4_ = auVar86._4_4_ * auVar85._4_4_ + auVar74._4_4_;
        auVar121._8_4_ = auVar86._8_4_ * auVar85._8_4_ + auVar74._8_4_;
        auVar121._12_4_ = auVar86._12_4_ * auVar85._12_4_ + auVar74._12_4_;
        auVar71 = vcmpps_avx(auVar139,auVar22,6);
        auVar71 = vpaddd_avx(auVar93,auVar71);
        auVar85 = vpmaxsd_avx(auVar71,_DAT_01feba10);
        auVar71 = vcmpps_avx(auVar121,auVar23,1);
        auVar71 = vpsubd_avx(auVar19,auVar71);
        auVar93 = vpminsd_avx(auVar71,auVar164);
        auVar71 = vblendvps_avx(auVar164,auVar85,auVar72);
        auVar85 = vpackusdw_avx(auVar71,auVar71);
        auVar71 = vandps_avx(auVar72,auVar93);
        auVar71 = vpackusdw_avx(auVar71,auVar71);
        auVar71 = vpackuswb_avx(auVar85,auVar71);
        auVar71 = vpshufd_avx(auVar71,0xd8);
        *(long *)(local_1d70 + lVar44 + 0x50) = auVar71._0_8_;
        *(float *)(local_1d70 + lVar44 + 0x68) = auVar99._0_4_;
        *(int *)(local_1d70 + lVar44 + 0x74) = auVar73._0_4_;
        auVar24._4_4_ = local_1820[9];
        auVar24._0_4_ = local_1820[8];
        auVar24._8_4_ = local_1820[10];
        auVar24._12_4_ = local_1820[0xb];
        auVar25._4_4_ = local_17f0.upper;
        auVar25._0_4_ = local_17f0.lower;
        auVar25._8_4_ = uStack_17e8;
        auVar25._12_4_ = uStack_17e4;
        auVar71 = vshufps_avx(auVar24,auVar24,0xb1);
        auVar71 = vminps_avx(auVar71,auVar24);
        auVar73 = vshufpd_avx(auVar71,auVar71,1);
        auVar99 = vminps_avx(auVar73,auVar71);
        auVar71 = vshufps_avx(auVar25,auVar25,0xb1);
        auVar71 = vmaxps_avx(auVar71,auVar25);
        auVar73 = vshufpd_avx(auVar71,auVar71,1);
        auVar71 = vmaxss_avx(auVar73,auVar71);
        fVar4 = (auVar71._0_4_ - auVar99._0_4_) * 1.0000002;
        auVar71 = vcmpss_avx(ZEXT416((uint)(fVar4 / 255.0)),ZEXT816(0) << 0x20,0);
        auVar73 = vblendvps_avx(ZEXT416((uint)(fVar4 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar71
                               );
        auVar71 = vcmpss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)fVar4),1);
        auVar71 = vandps_avx(auVar71,ZEXT416((uint)(255.0 / fVar4)));
        auVar74 = vshufps_avx(auVar99,auVar99,0);
        auVar85 = vsubps_avx(auVar24,auVar74);
        auVar72 = vshufps_avx(auVar71,auVar71,0);
        auVar129._0_4_ = auVar85._0_4_ * auVar72._0_4_;
        auVar129._4_4_ = auVar85._4_4_ * auVar72._4_4_;
        auVar129._8_4_ = auVar85._8_4_ * auVar72._8_4_;
        auVar129._12_4_ = auVar85._12_4_ * auVar72._12_4_;
        auVar71 = vroundps_avx(auVar129,1);
        auVar71 = vcvtps2dq_avx(auVar71);
        auVar93 = vpmaxsd_avx(auVar71,_DAT_01feba10);
        auVar71 = vsubps_avx(auVar25,auVar74);
        auVar110._0_4_ = auVar71._0_4_ * auVar72._0_4_;
        auVar110._4_4_ = auVar71._4_4_ * auVar72._4_4_;
        auVar110._8_4_ = auVar71._8_4_ * auVar72._8_4_;
        auVar110._12_4_ = auVar71._12_4_ * auVar72._12_4_;
        auVar71 = vroundps_avx(auVar110,2);
        auVar71 = vcvtps2dq_avx(auVar71);
        auVar19 = vpminsd_avx(auVar71,auVar164);
        auVar71 = vcvtdq2ps_avx(auVar93);
        auVar86 = vshufps_avx(auVar73,auVar73,0);
        auVar85 = vcvtdq2ps_avx(auVar19);
        auVar154._8_4_ = 0x7f800000;
        auVar154._0_8_ = 0x7f8000007f800000;
        auVar154._12_4_ = 0x7f800000;
        auVar72 = vcmpps_avx(auVar154,auVar24,4);
        auVar140._0_4_ = auVar86._0_4_ * auVar71._0_4_ + auVar74._0_4_;
        auVar140._4_4_ = auVar86._4_4_ * auVar71._4_4_ + auVar74._4_4_;
        auVar140._8_4_ = auVar86._8_4_ * auVar71._8_4_ + auVar74._8_4_;
        auVar140._12_4_ = auVar86._12_4_ * auVar71._12_4_ + auVar74._12_4_;
        auVar122._0_4_ = auVar86._0_4_ * auVar85._0_4_ + auVar74._0_4_;
        auVar122._4_4_ = auVar86._4_4_ * auVar85._4_4_ + auVar74._4_4_;
        auVar122._8_4_ = auVar86._8_4_ * auVar85._8_4_ + auVar74._8_4_;
        auVar122._12_4_ = auVar86._12_4_ * auVar85._12_4_ + auVar74._12_4_;
        auVar71 = vcmpps_avx(auVar140,auVar24,6);
        auVar71 = vpaddd_avx(auVar93,auVar71);
        auVar85 = vpmaxsd_avx(auVar71,_DAT_01feba10);
        auVar71 = vcmpps_avx(auVar122,auVar25,1);
        auVar71 = vpsubd_avx(auVar19,auVar71);
        auVar93 = vpminsd_avx(auVar71,auVar164);
        auVar71 = vblendvps_avx(auVar164,auVar85,auVar72);
        auVar85 = vpackusdw_avx(auVar71,auVar71);
        auVar71 = vandps_avx(auVar72,auVar93);
        auVar71 = vpackusdw_avx(auVar71,auVar71);
        auVar71 = vpackuswb_avx(auVar85,auVar71);
        auVar71 = vpshufd_avx(auVar71,0xd8);
        *(long *)(local_1d70 + lVar44 + 0x58) = auVar71._0_8_;
        *(float *)(local_1d70 + lVar44 + 0x6c) = auVar99._0_4_;
        *(int *)(local_1d70 + lVar44 + 0x78) = auVar73._0_4_;
        auVar26._4_4_ = local_17e0[1];
        auVar26._0_4_ = local_17e0[0];
        auVar26._8_4_ = local_17e0[2];
        auVar26._12_4_ = local_17e0[3];
        auVar27._4_4_ = local_17e0[5];
        auVar27._0_4_ = local_17e0[4];
        auVar27._8_4_ = local_17e0[6];
        auVar27._12_4_ = local_17e0[7];
        auVar71 = vshufps_avx(auVar26,auVar26,0xb1);
        auVar71 = vminps_avx(auVar71,auVar26);
        auVar73 = vshufpd_avx(auVar71,auVar71,1);
        auVar99 = vminps_avx(auVar73,auVar71);
        auVar71 = vshufps_avx(auVar27,auVar27,0xb1);
        auVar71 = vmaxps_avx(auVar71,auVar27);
        auVar73 = vshufpd_avx(auVar71,auVar71,1);
        auVar71 = vmaxss_avx(auVar73,auVar71);
        fVar4 = (auVar71._0_4_ - auVar99._0_4_) * 1.0000002;
        auVar71 = vcmpss_avx(ZEXT416(0) << 0x20,ZEXT416((uint)(fVar4 / 255.0)),0);
        auVar72 = vblendvps_avx(ZEXT416((uint)(fVar4 / 255.0)),SUB6416(ZEXT464(0x1000000),0),auVar71
                               );
        auVar71 = vcmpss_avx(ZEXT416(0) << 0x20,ZEXT416((uint)fVar4),1);
        auVar71 = vandps_avx(auVar71,ZEXT416((uint)(255.0 / fVar4)));
        auVar19 = vshufps_avx(auVar99,auVar99,0);
        auVar85 = vsubps_avx(auVar26,auVar19);
        auVar73 = vshufps_avx(auVar71,auVar71,0);
        auVar130._0_4_ = auVar85._0_4_ * auVar73._0_4_;
        auVar130._4_4_ = auVar85._4_4_ * auVar73._4_4_;
        auVar130._8_4_ = auVar85._8_4_ * auVar73._8_4_;
        auVar130._12_4_ = auVar85._12_4_ * auVar73._12_4_;
        auVar71 = vroundps_avx(auVar130,1);
        auVar71 = vcvtps2dq_avx(auVar71);
        auVar85 = vpmaxsd_avx(auVar71,_DAT_01feba10);
        auVar71 = vsubps_avx(auVar27,auVar19);
        auVar111._0_4_ = auVar71._0_4_ * auVar73._0_4_;
        auVar111._4_4_ = auVar71._4_4_ * auVar73._4_4_;
        auVar111._8_4_ = auVar71._8_4_ * auVar73._8_4_;
        auVar111._12_4_ = auVar71._12_4_ * auVar73._12_4_;
        auVar71 = vroundps_avx(auVar111,2);
        auVar71 = vcvtps2dq_avx(auVar71);
        auVar93 = vpminsd_avx(auVar71,auVar164);
        auVar71 = vcvtdq2ps_avx(auVar85);
        auVar74 = vshufps_avx(auVar72,auVar72,0);
        auVar73 = vcvtdq2ps_avx(auVar93);
        auVar141._0_4_ = auVar74._0_4_ * auVar71._0_4_ + auVar19._0_4_;
        auVar141._4_4_ = auVar74._4_4_ * auVar71._4_4_ + auVar19._4_4_;
        auVar141._8_4_ = auVar74._8_4_ * auVar71._8_4_ + auVar19._8_4_;
        auVar141._12_4_ = auVar74._12_4_ * auVar71._12_4_ + auVar19._12_4_;
        auVar123._0_4_ = auVar74._0_4_ * auVar73._0_4_ + auVar19._0_4_;
        auVar123._4_4_ = auVar74._4_4_ * auVar73._4_4_ + auVar19._4_4_;
        auVar123._8_4_ = auVar74._8_4_ * auVar73._8_4_ + auVar19._8_4_;
        auVar123._12_4_ = auVar74._12_4_ * auVar73._12_4_ + auVar19._12_4_;
        auVar71 = vcmpps_avx(auVar141,auVar26,6);
        auVar85 = vpaddd_avx(auVar71,auVar85);
        auVar71 = (undefined1  [16])0x0;
        auVar73 = vcmpps_avx(auVar123,auVar27,1);
        auVar93 = vpsubd_avx(auVar93,auVar73);
        auVar112._8_4_ = 0x7f800000;
        auVar112._0_8_ = 0x7f8000007f800000;
        auVar112._12_4_ = 0x7f800000;
        auVar73 = vcmpps_avx(auVar26,auVar112,4);
        auVar85 = vpmaxsd_avx(auVar85,(undefined1  [16])0x0);
        auVar85 = vblendvps_avx(auVar164,auVar85,auVar73);
        auVar93 = vpminsd_avx(auVar93,auVar164);
        auVar73 = vandps_avx(auVar73,auVar93);
        auVar85 = vpackusdw_avx(auVar85,auVar85);
        auVar73 = vpackusdw_avx(auVar73,auVar73);
        auVar73 = vpackuswb_avx(auVar85,auVar73);
        auVar73 = vpshufd_avx(auVar73,0xd8);
        *(long *)(local_1d70 + lVar44 + 0x60) = auVar73._0_8_;
        *(float *)(local_1d70 + lVar44 + 0x70) = auVar99._0_4_;
        *(int *)(local_1d70 + lVar44 + 0x7c) = auVar72._0_4_;
        local_1d68 = local_1d68 + 1;
        pcVar65 = pcVar65 + 0x90;
      } while (local_1d68 != local_1d80);
    }
    (local_1e78->ref).ptr = local_1a90;
    *(undefined8 *)&(local_1e78->lbounds).bounds0.lower.field_0 = local_1ec0._0_8_;
    *(undefined8 *)((long)&(local_1e78->lbounds).bounds0.lower.field_0 + 8) = local_1ec0._8_8_;
    *(undefined1 (*) [16])(local_1e78->lbounds).bounds0.upper.field_0.m128 = auVar162;
    *(undefined8 *)&(local_1e78->lbounds).bounds1.lower.field_0 = local_1e60._0_8_;
    *(undefined8 *)((long)&(local_1e78->lbounds).bounds1.lower.field_0 + 8) = local_1e60._8_8_;
    *(undefined8 *)&(local_1e78->lbounds).bounds1.upper.field_0 = local_1e50._0_8_;
    *(undefined8 *)((long)&(local_1e78->lbounds).bounds1.upper.field_0 + 8) = local_1e50._8_8_;
    local_1e78->dt = BStack_1898;
    return local_1e78;
  }
  lVar39 = 0xbc;
  do {
    *(undefined8 *)((long)&uStack_124c + lVar39) = 0xffffffff7f800000;
    *(undefined8 *)(&stack0xffffffffffffedbc + lVar39) = 0;
    lVar39 = lVar39 + 0xf0;
  } while (lVar39 != 0xfbc);
  local_2c0 = 1;
  local_b8 = 1;
  local_1240.my_parent = ptVar8;
  aStack_1230 = (anon_union_8_2_d71db6ad_for_task_group_context_11)local_1ee0._0_8_;
  BStack_1228 = stack0xffffffffffffe128;
  local_1220 = local_1f40;
  aStack_1210 = local_1ef0;
  local_1200 = local_18f0;
  local_11f0 = local_18e0;
  _local_11e0 = local_18d0;
  local_11d0.lower = (float)rVar29._begin;
  local_11d0.upper = rVar29._begin._4_4_;
  uStack_11c8 = (undefined4)rVar29._end;
  uStack_11c4 = rVar29._end._4_4_;
  BStack_11c0 = local_1840;
  sStack_11b8 = sStack_1838;
  local_11b0 = BStack_1830;
  BStack_11a8 = BStack_1828;
  local_11a0[0] = BVar40;
  local_1190._8_8_ = lStack_1238;
  local_2b8 = BVar40;
  local_2b0[0].lower = 2.8026e-45;
  local_2b0[0].upper = 0.0;
  local_340[0] = &local_2b8;
  local_1f00 = &local_1c20;
  local_1e90 = &local_1b10;
  local_1e98 = (HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::VirtualRecalculatePrimRef,_2UL>
                *)&this->heuristicTemporalSplit;
  local_1e50._0_8_ = &BStack_1c50;
  local_1e60._0_8_ = &BStack_1b40;
  local_1ee0._8_4_ = 0x7f800000;
  local_1ee0._0_8_ = 0x7f8000007f800000;
  uStack_1ed4 = INFINITY;
  local_1f20._end._0_4_ = 0xff800000;
  local_1f20._begin = 0xff800000ff800000;
  local_1f20._end._4_4_ = 0xff800000;
  local_1eb0 = 0;
  uStack_1eac = 0;
  do {
    if (local_2c0 == 0) {
      uVar68 = 0xffffffffffffffff;
    }
    else {
      uVar68 = 0xffffffffffffffff;
      pBVar51 = &local_11d0;
      uVar42 = 0;
      uVar58 = 0;
      do {
        uVar60 = (long)pBVar51[1] - (long)*pBVar51;
        if ((((this->cfg).maxLeafSize < uVar60) || (1 < (uint)pBVar51[9].upper)) || (bVar64 != 0)) {
          if (uVar42 < uVar60) {
            uVar68 = uVar58;
            uVar42 = uVar60;
          }
          bVar64 = 0;
        }
        uVar58 = uVar58 + 1;
        pBVar51 = pBVar51 + 0x1e;
      } while (local_2c0 != uVar58);
    }
    if (uVar68 != 0xffffffffffffffff) {
      local_1cd0._0_8_ = (long)&local_1930->my_cpu_ctl_env + 1;
      local_1c20.my_parent = (task_group_context *)0xffffffff7f800000;
      uStack_1c18 = 0;
      local_1bc8._8_8_ = local_1cd0._0_8_;
      local_1b10.my_parent = (task_group_context *)0xffffffff7f800000;
      uStack_1b08 = 0;
      iVar7 = *(int *)((long)local_1180 + uVar68 * 0xf0 + -4);
      local_1f40._0_8_ = &local_1240 + uVar68 * 0x1e;
      local_1ef0._0_8_ = &local_1190 + uVar68 * 0xf;
      if (iVar7 == 0) {
        BVar40 = (&local_11d0)[uVar68 * 0x1e];
        sVar47 = *(size_t *)(&uStack_11c8 + uVar68 * 0x3c);
        local_1d60._0_8_ = (ThreadLocal2 *)0x7f8000007f800000;
        local_1d60._8_4_ = INFINITY;
        local_1d60._12_4_ = INFINITY;
        aStack_1d50.m128[0] = -INFINITY;
        aStack_1d50.m128[1] = -INFINITY;
        aStack_1d50.m128[2] = -INFINITY;
        aStack_1d50.m128[3] = -INFINITY;
        local_1d40.i[0] = 0x7f800000;
        local_1d40.i[1] = 0x7f800000;
        local_1d40.i[2] = 0x7f800000;
        local_1d40.i[3] = 0x7f800000;
        aStack_1d30.i[0] = -0x800000;
        aStack_1d30.i[1] = -0x800000;
        aStack_1d30.i[2] = -0x800000;
        aStack_1d30.i[3] = -0x800000;
        local_1d20.m128[0] = INFINITY;
        local_1d20.m128[1] = INFINITY;
        local_1d20.m128[2] = INFINITY;
        local_1d20.m128[3] = INFINITY;
        aStack_1d10.m128[0] = -INFINITY;
        aStack_1d10.m128[1] = -INFINITY;
        aStack_1d10.m128[2] = -INFINITY;
        aStack_1d10.m128[3] = -INFINITY;
        local_1ce0 = 0.0;
        local_1d00.lower = 0.0;
        local_1d00.upper = 0.0;
        BStack_1cf8.lower = 0.0;
        BStack_1cf8.upper = 0.0;
        sStack_1cf0 = 0;
        sStack_1ce8 = 0;
        auVar100._8_4_ = 0x3f800000;
        auVar100._0_8_ = &DAT_3f8000003f800000;
        auVar100._12_4_ = 0x3f800000;
        uVar52 = vmovlps_avx(auVar100);
        fStack_1cdc = (float)uVar52;
        fStack_1cd8 = (float)((ulong)uVar52 >> 0x20);
        fStack_1cd4 = 0.0;
        local_1e10._0_8_ = (task_group_context *)0x7f8000007f800000;
        local_1e10.m128[2] = INFINITY;
        local_1e10.m128[3] = INFINITY;
        uStack_1e00 = 0xff800000ff800000;
        uStack_1df8 = 0xff800000;
        uStack_1df4 = 0xff800000;
        local_1df0 = 0x7f800000;
        uStack_1dec = 0x7f800000;
        uStack_1de8 = 0x7f800000;
        uStack_1de4 = 0x7f800000;
        uStack_1de0 = 0xff800000;
        uStack_1ddc = 0xff800000;
        uStack_1dd8 = 0xff800000;
        uStack_1dd4 = 0xff800000;
        local_1dd0 = 0x7f800000;
        uStack_1dcc = 0x7f800000;
        uStack_1dc8 = 0x7f800000;
        uStack_1dc4 = 0x7f800000;
        uStack_1dc0 = 0xff800000;
        uStack_1dbc = 0xff800000;
        fStack_1db8 = -INFINITY;
        fStack_1db4 = -INFINITY;
        local_1d90 = 0;
        local_1db0.lower = 0.0;
        local_1db0.upper = 0.0;
        sStack_1da8 = 0;
        uStack_1da0 = 0;
        uStack_1d98 = 0;
        uVar52 = vmovlps_avx(auVar100);
        uStack_1d8c = (undefined4)uVar52;
        uStack_1d88 = (undefined4)((ulong)uVar52 >> 0x20);
        uStack_1d84 = 0;
        local_19b0._4_4_ = *(undefined4 *)(local_1180 + uVar68 * 0x1e + -1);
        local_19b0._0_4_ = local_19b0._4_4_;
        stack0xffffffffffffe658 =
             (anon_union_16_2_47237d3f_for_Vec3fa_0 *)CONCAT44(local_19b0._4_4_,local_19b0._4_4_);
        lVar39 = (long)(1 << (*(byte *)((long)&local_1190 + uVar68 * 0xf0 + 4) & 0x1f)) * 0x10;
        local_1ac0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar39);
        local_1ac0._8_8_ = *(float **)(mm_lookupmask_ps + lVar39 + 8);
        local_1a40._0_8_ = &local_1190 + uVar68 * 0xf;
        local_1a40._8_8_ = local_19b0;
        local_1a30._0_8_ = &local_1ac0;
        BStack_1c58 = (BBox1f)parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::avx::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                        (*(PrimRefMB **)((long)local_11a0[uVar68 * 0x1e] + 0x20),
                                         (size_t)BVar40,sVar47,(EmptyTy *)local_1a50,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1d60,
                                         (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)
                                         &local_1e10.field_1,
                                         (anon_class_24_3_c5d13451 *)(local_1a50 + 0x10),
                                         (anon_class_1_0_00000001 *)&local_1bd8,
                                         (anon_class_1_0_00000001 *)&local_1a68,0x80,0xc00);
        local_1c30 = local_11a0[uVar68 * 0x1e];
        auVar70._8_8_ = 0;
        auVar70._0_4_ = local_11a0[uVar68 * 0x1e + -1].lower;
        auVar70._4_4_ = local_11a0[uVar68 * 0x1e + -1].upper;
        local_1cc0[0]._12_4_ = local_1d60._12_4_;
        local_1cc0[0]._8_4_ = local_1d60._8_4_;
        local_1cc0[1]._4_4_ = aStack_1d50.m128[1];
        local_1cc0[1]._0_4_ = aStack_1d50.m128[0];
        local_1cc0[1]._12_4_ = aStack_1d50.m128[3];
        local_1cc0[1]._8_4_ = aStack_1d50.m128[2];
        local_1cc0[2]._0_8_ = CONCAT44(local_1d40.i[1],local_1d40.i[0]);
        local_1cc0[2]._12_4_ = local_1d40.i[3];
        local_1cc0[2]._8_4_ = local_1d40.i[2];
        local_1cc0[3]._4_4_ = aStack_1d30.i[1];
        local_1cc0[3]._0_4_ = aStack_1d30.i[0];
        local_1cc0[3]._12_4_ = aStack_1d30.i[3];
        local_1cc0[3]._8_4_ = aStack_1d30.i[2];
        local_1c80.upper = local_1d20.m128[1];
        local_1c80.lower = local_1d20.m128[0];
        BStack_1c78.upper = local_1d20.m128[3];
        BStack_1c78.lower = local_1d20.m128[2];
        BStack_1c70.upper = aStack_1d10.m128[1];
        BStack_1c70.lower = aStack_1d10.m128[0];
        BStack_1c68.upper = aStack_1d10.m128[3];
        BStack_1c68.lower = aStack_1d10.m128[2];
        local_1cc0[0]._0_8_ = local_1d60._0_8_;
        *(size_t *)local_1e50._0_8_ = sStack_1cf0;
        *(size_t *)(local_1e50._0_8_ + 8) = sStack_1ce8;
        *(size_t *)(local_1e50._0_8_ + 0x10) = CONCAT44(fStack_1cdc,local_1ce0);
        *(size_t *)(local_1e50._0_8_ + 0x18) = CONCAT44(fStack_1cd4,fStack_1cd8);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = auStack_1c40._8_8_;
        auVar71 = vcmpps_avx(auVar83,auVar70,1);
        auVar73 = vinsertps_avx(auVar70,auVar83,0x50);
        auVar72 = vinsertps_avx(auVar83,auVar70,0x50);
        auVar71 = vblendvps_avx(auVar72,auVar73,auVar71);
        uVar52 = vmovlps_avx(auVar71);
        auStack_1c40._8_8_ = uVar52;
        stack0xffffffffffffe450 = local_1e10._0_8_;
        aStack_1ba8._0_8_ = local_1e10._8_8_;
        aStack_1b98._0_8_ = CONCAT44(uStack_1df4,uStack_1df8);
        aStack_1ba8._8_8_ = uStack_1e00;
        aStack_1b98._8_8_ = CONCAT44(uStack_1dec,local_1df0);
        aStack_1b88._0_8_ = CONCAT44(uStack_1de4,uStack_1de8);
        aStack_1b88._8_8_ = CONCAT44(uStack_1ddc,uStack_1de0);
        uStack_1b78 = CONCAT44(uStack_1dd4,uStack_1dd8);
        local_1b70 = CONCAT44(uStack_1dcc,local_1dd0);
        sStack_1b68 = CONCAT44(uStack_1dc4,uStack_1dc8);
        sStack_1b60 = CONCAT44(uStack_1dbc,uStack_1dc0);
        BStack_1b58.upper = fStack_1db4;
        BStack_1b58.lower = fStack_1db8;
        *(undefined8 *)local_1e60._0_8_ = uStack_1da0;
        *(undefined8 *)(local_1e60._0_8_ + 8) = uStack_1d98;
        *(ulong *)(local_1e60._0_8_ + 0x10) = CONCAT44(uStack_1d8c,local_1d90);
        *(ulong *)(local_1e60._0_8_ + 0x18) = CONCAT44(uStack_1d84,uStack_1d88);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = auStack_1b30._8_8_;
        auVar71 = vcmpps_avx(auVar84,auVar70,1);
        auVar73 = vinsertps_avx(auVar70,auVar84,0x50);
        auVar72 = vinsertps_avx(auVar84,auVar70,0x50);
        auVar71 = vblendvps_avx(auVar72,auVar73,auVar71);
        uVar52 = vmovlps_avx(auVar71);
        auStack_1b30._8_8_ = uVar52;
        local_1c60 = BVar40;
        local_1b50 = BStack_1c58;
        sStack_1b48 = sVar47;
        local_1b20 = local_1c30;
LAB_0145d887:
        local_1f48.lower = 0.0;
        local_1f48.upper = 0.0;
      }
      else {
        local_1f08 = &aStack_1230 + uVar68 * 0x1e;
        if (iVar7 != 2) {
          if (iVar7 == 1) {
            SetMB::deterministic_order((SetMB *)local_1f08);
            splitFallback(local_1f28,(SetMB *)local_1f08,(SetMB *)&local_1cc0[0].field_1,
                          (SetMB *)(auStack_1bb8 + 8));
          }
          else if (iVar7 == 3) {
            SetMB::deterministic_order((SetMB *)local_1f08);
            splitByGeometry(local_1f28,(SetMB *)local_1f08,(SetMB *)&local_1cc0[0].field_1,
                            (SetMB *)(auStack_1bb8 + 8));
          }
          goto LAB_0145d887;
        }
        local_1e70._0_4_ = *(undefined4 *)(local_1180 + uVar68 * 0x1e + -1);
        local_1e70._8_4_ = local_11a0[uVar68 * 0x1e + -1].lower;
        local_1e70._4_4_ = local_11a0[uVar68 * 0x1e + -1].upper;
        local_1ec0._0_4_ = local_11a0[uVar68 * 0x1e].lower;
        local_1ec0._4_4_ = local_11a0[uVar68 * 0x1e].upper;
        local_1e70._12_4_ = local_1e70._0_4_;
        BVar40 = (BBox1f)operator_new(0x28);
        pMVar9 = local_1e98->device;
        lVar39 = *(long *)(&uStack_11c8 + uVar68 * 0x3c);
        *(MemoryMonitorInterface **)BVar40 = pMVar9;
        *(undefined1 *)((long)BVar40 + 8) = 0;
        *(long *)((long)BVar40 + 0x10) = 0;
        *(long *)((long)BVar40 + 0x18) = 0;
        *(long *)((long)BVar40 + 0x20) = 0;
        lVar39 = lVar39 - (long)(&local_11d0)[uVar68 * 0x1e];
        uVar52 = &local_1240 + uVar68 * 0x1e;
        if (lVar39 != 0) {
          uVar42 = lVar39 * 0x50;
          local_1e30 = lVar39;
          (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,uVar42,0);
          if (uVar42 < 0x1c00000) {
            pvVar41 = alignedMalloc(uVar42,0x10);
          }
          else {
            pvVar41 = os_malloc(uVar42,(bool *)((long)BVar40 + 8));
          }
          *(void **)((long)BVar40 + 0x20) = pvVar41;
          *(long *)((long)BVar40 + 0x10) = local_1e30;
          *(long *)((long)BVar40 + 0x18) = local_1e30;
          uVar52 = local_1f40._0_8_;
        }
        uVar31 = local_1a40._8_8_;
        local_1ac0._0_8_ = local_1ec0._0_8_;
        local_1ac0._8_8_ = ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_1e70)->m128 + 2;
        local_1ab0 = local_1e98;
        local_1aa8 = local_1e28;
        local_1aa0 = local_1f08;
        paVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  ((anon_union_8_2_d71db6ad_for_task_group_context_11 *)(uVar52 + 0x70))->my_parent;
        paVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                  ((anon_union_8_2_d71db6ad_for_task_group_context_11 *)(uVar52 + 0x78))->my_parent;
        local_1e10._0_8_ = (task_group_context *)0x7f8000007f800000;
        local_1e10.m128[2] = INFINITY;
        local_1e10.m128[3] = INFINITY;
        uStack_1e00 = 0xff800000ff800000;
        uStack_1df8 = 0xff800000;
        uStack_1df4 = 0xff800000;
        local_1df0 = 0x7f800000;
        uStack_1dec = 0x7f800000;
        uStack_1de8 = 0x7f800000;
        uStack_1de4 = 0x7f800000;
        uStack_1de0 = 0xff800000;
        uStack_1ddc = 0xff800000;
        uStack_1dd8 = 0xff800000;
        uStack_1dd4 = 0xff800000;
        local_1dd0 = 0x7f800000;
        uStack_1dcc = 0x7f800000;
        uStack_1dc8 = 0x7f800000;
        uStack_1dc4 = 0x7f800000;
        uStack_1dc0 = 0xff800000;
        uStack_1dbc = 0xff800000;
        fStack_1db8 = -INFINITY;
        fStack_1db4 = -INFINITY;
        local_1d90 = 0;
        local_1db0.lower = 0.0;
        local_1db0.upper = 0.0;
        sStack_1da8 = 0;
        uStack_1da0 = 0;
        uStack_1d98 = 0;
        auVar71._8_4_ = 0x3f800000;
        auVar71._0_8_ = &DAT_3f8000003f800000;
        auVar71._12_4_ = 0x3f800000;
        uVar52 = vmovlps_avx(auVar71);
        uStack_1d8c = (undefined4)uVar52;
        uStack_1d88 = (undefined4)((ulong)uVar52 >> 0x20);
        uStack_1d84 = 0;
        local_1f48 = BVar40;
        local_1e28[0] = BVar40;
        if ((ulong)((long)paVar11 - (long)paVar10) < 0xc00) {
          local_1a40._0_8_ = paVar10;
          local_1a40._8_8_ = paVar11;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    ((PrimInfoMB *)local_1d60,(anon_class_40_5_808acc65 *)&local_1ac0.field_1,
                     (range<unsigned_long> *)(local_1a50 + 0x10));
        }
        else {
          local_1a40._12_1_ = 1;
          local_1a20._0_8_ = 0;
          local_1a20._8_8_ = 0;
          local_1a00._0_8_ = 8;
          local_1a40._14_2_ = SUB82(uVar31,6);
          local_1a40._13_1_ = 4;
          tbb::detail::r1::initialize((task_group_context *)(local_1a50 + 0x10));
          local_19a0 = (anon_union_8_2_d71db6ad_for_task_group_context_11)0x80;
          local_1bd8._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_1bd8._8_8_ = &local_1ac0;
          local_19b0._0_8_ = paVar11;
          unique0x1000a5cf = paVar10;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMB *)local_1d60,(d1 *)local_19b0,
                     (blocked_range<unsigned_long> *)&local_1e10.field_1,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1bd8,
                     (anon_class_16_2_ed117de8_conflict20 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)(local_1a50 + 0x10),in_stack_ffffffffffffe080);
          cVar36 = tbb::detail::r1::is_group_execution_cancelled
                             ((task_group_context *)(local_1a50 + 0x10));
          if (cVar36 != '\0') {
            prVar49 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar49,"task cancelled");
            __cxa_throw(prVar49,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)(local_1a50 + 0x10));
        }
        uVar57 = *(long *)(local_1f40._0_8_ + 0x78) - *(long *)(local_1f40._0_8_ + 0x70);
        if ((long)BStack_1cf8 - (long)local_1d00 != uVar57) {
          local_1e10._0_8_ = ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_1e70)->m128 + 2;
          BStack_1cf8 = (BBox1f)parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                          (*(PrimRefMB **)((long)local_1e28[0] + 0x20),0,uVar57,
                                           0x400,(anon_class_8_1_41ce32a5 *)&local_1e10.field_1);
        }
        paVar32 = stack0xffffffffffffe658;
        auVar72._4_4_ = local_1e70._12_4_;
        auVar72._0_4_ = local_1e70._8_4_;
        auVar72._8_8_ = 0;
        local_1cc0[0]._12_4_ = local_1d60._12_4_;
        local_1cc0[0]._8_4_ = local_1d60._8_4_;
        local_1cc0[1]._4_4_ = aStack_1d50.m128[1];
        local_1cc0[1]._0_4_ = aStack_1d50.m128[0];
        local_1cc0[1]._12_4_ = aStack_1d50.m128[3];
        local_1cc0[1]._8_4_ = aStack_1d50.m128[2];
        local_1cc0[2]._0_8_ = CONCAT44(local_1d40.i[1],local_1d40.i[0]);
        local_1cc0[2]._12_4_ = local_1d40.i[3];
        local_1cc0[2]._8_4_ = local_1d40.i[2];
        local_1cc0[3]._4_4_ = aStack_1d30.i[1];
        local_1cc0[3]._0_4_ = aStack_1d30.i[0];
        local_1cc0[3]._12_4_ = aStack_1d30.i[3];
        local_1cc0[3]._8_4_ = aStack_1d30.i[2];
        local_1c80.upper = local_1d20.m128[1];
        local_1c80.lower = local_1d20.m128[0];
        BStack_1c78.upper = local_1d20.m128[3];
        BStack_1c78.lower = local_1d20.m128[2];
        BStack_1c70.upper = aStack_1d10.m128[1];
        BStack_1c70.lower = aStack_1d10.m128[0];
        BStack_1c68.upper = aStack_1d10.m128[3];
        BStack_1c68.lower = aStack_1d10.m128[2];
        *(size_t *)local_1e50._0_8_ = sStack_1cf0;
        *(size_t *)(local_1e50._0_8_ + 8) = sStack_1ce8;
        local_1cc0[0]._0_8_ = local_1d60._0_8_;
        local_1c60 = local_1d00;
        BStack_1c58 = BStack_1cf8;
        auVar85._4_4_ = fStack_1cdc;
        auVar85._0_4_ = local_1ce0;
        auVar85._8_8_ = 0;
        auVar93._4_4_ = fStack_1cd4;
        auVar93._0_4_ = fStack_1cd8;
        auVar93._8_8_ = 0;
        auVar71 = vcmpps_avx(auVar93,auVar72,1);
        auVar73 = vinsertps_avx(auVar72,auVar93,0x50);
        auVar72 = vinsertps_avx(auVar93,auVar72,0x50);
        auVar71 = vblendvps_avx(auVar72,auVar73,auVar71);
        auStack_1c40 = vmovlhps_avx(auVar85,auVar71);
        local_1c30 = local_1e28[0];
        local_1a68.prims = (mvector<embree::PrimRefMB> *)local_1ec0._0_8_;
        local_1a68.time_range1 = (BBox1f *)local_1e70;
        local_1a68.this = local_1e98;
        paVar10 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_1f40._0_8_ + 0x70);
        paVar11 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_1f40._0_8_ + 0x78);
        local_1a40._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)0x7f8000007f800000;
        local_1a40._8_8_ = (undefined1 *)0x7f8000007f800000;
        local_1a30._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)0xff800000ff800000;
        local_1a30.m128[2] = -INFINITY;
        local_1a30.m128[3] = -INFINITY;
        local_1a20._0_8_ = 0x7f8000007f800000;
        local_1a20._8_8_ = 0x7f8000007f800000;
        local_1a10.m128[0] = -INFINITY;
        local_1a10.m128[1] = -INFINITY;
        local_1a10.m128[2] = -INFINITY;
        local_1a10.m128[3] = -INFINITY;
        local_1a00._0_8_ = 0x7f8000007f800000;
        local_1a00.m128[2] = INFINITY;
        local_1a00.m128[3] = INFINITY;
        local_19f0 = 0xff800000;
        uStack_19ec = 0xff800000;
        uStack_19e8 = 0xff800000;
        uStack_19e4 = 0xff800000;
        local_19c0 = 0;
        local_19e0 = 0;
        sStack_19d8 = 0;
        BStack_19d0.lower = 0.0;
        BStack_19d0.upper = 0.0;
        BStack_19c8.lower = 0.0;
        BStack_19c8.upper = 0.0;
        auVar73._8_4_ = 0x3f800000;
        auVar73._0_8_ = &DAT_3f8000003f800000;
        auVar73._12_4_ = 0x3f800000;
        local_19bc = vmovlps_avx(auVar73);
        local_19b4 = 0;
        if ((ulong)((long)paVar11 - (long)paVar10) < 0xc00) {
          local_19b0._0_8_ = paVar10;
          unique0x1000a5d7 = paVar11;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    ((PrimInfoMB *)&local_1e10.field_1,&local_1a68,
                     (range<unsigned_long> *)local_19b0);
        }
        else {
          local_1990 = (intrusive_list_node *)0x0;
          piStack_1988 = (intrusive_list_node *)0x0;
          local_1970 = CUSTOM_CTX;
          uStack_19a4._2_2_ = SUB82(paVar32,6);
          stack0xffffffffffffe658 =
               CONCAT15((context_traits)0x4,CONCAT14(proxy_support,local_19b0._8_4_));
          tbb::detail::r1::initialize((task_group_context *)local_19b0);
          local_1bc8._0_8_ = 0x80;
          local_1a50._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_1a50._8_8_ = &local_1a68;
          local_1bd8._0_8_ = paVar11;
          local_1bd8._8_8_ = paVar10;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1e10.field_1,
                     (d1 *)&local_1bd8,(blocked_range<unsigned_long> *)(local_1a50 + 0x10),
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1a50,
                     (anon_class_16_2_ed117de8_conflict21 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)local_19b0,in_stack_ffffffffffffe080);
          cVar36 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_19b0);
          if (cVar36 != '\0') {
            prVar49 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar49,"task cancelled");
            __cxa_throw(prVar49,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)local_19b0);
        }
        lVar39 = sStack_1da8 - (long)local_1db0;
        local_1db0 = *(BBox1f *)(local_1f40._0_8_ + 0x70);
        sStack_1da8 = lVar39 + (long)local_1db0;
        if (lVar39 != *(unsigned_long *)(local_1f40._0_8_ + 0x78) - (long)local_1db0) {
          local_1a40._0_8_ = local_1e70;
          sStack_1da8 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::avx::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::avx::GridRecalculatePrimRef,2ul>::split(embree::avx::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                                  (*(PrimRefMB **)(local_1ec0._0_8_ + 0x20),
                                   (unsigned_long)local_1db0,
                                   *(unsigned_long *)(local_1f40._0_8_ + 0x78),0x400,
                                   (anon_class_8_1_41ce32a6 *)(local_1a50 + 0x10));
        }
        auVar85 = local_1ec0;
        auVar74._4_4_ = local_1e70._4_4_;
        auVar74._0_4_ = local_1e70._0_4_;
        auVar74._8_8_ = 0;
        unique0x10004af0 = local_1e10._0_8_;
        aStack_1ba8.m128[0] = local_1e10.m128[2];
        aStack_1ba8.m128[1] = local_1e10.m128[3];
        aStack_1ba8._8_8_ = uStack_1e00;
        aStack_1b98._0_8_ = CONCAT44(uStack_1df4,uStack_1df8);
        aStack_1b98._8_8_ = CONCAT44(uStack_1dec,local_1df0);
        aStack_1b88._0_8_ = CONCAT44(uStack_1de4,uStack_1de8);
        aStack_1b88._8_8_ = CONCAT44(uStack_1ddc,uStack_1de0);
        uStack_1b78 = CONCAT44(uStack_1dd4,uStack_1dd8);
        local_1b70 = CONCAT44(uStack_1dcc,local_1dd0);
        sStack_1b68 = CONCAT44(uStack_1dc4,uStack_1dc8);
        sStack_1b60 = CONCAT44(uStack_1dbc,uStack_1dc0);
        BStack_1b58.upper = fStack_1db4;
        BStack_1b58.lower = fStack_1db8;
        auVar19._8_8_ = uStack_1d98;
        auVar19._0_8_ = uStack_1da0;
        *(undefined1 (*) [16])local_1e60._0_8_ = auVar19;
        local_1b50 = local_1db0;
        sStack_1b48 = sStack_1da8;
        auVar86._4_4_ = uStack_1d84;
        auVar86._0_4_ = uStack_1d88;
        auVar86._8_8_ = 0;
        auVar71 = vcmpps_avx(auVar86,auVar74,1);
        auVar73 = vinsertps_avx(auVar74,auVar86,0x50);
        auVar72 = vinsertps_avx(auVar86,auVar74,0x50);
        auVar71 = vblendvps_avx(auVar72,auVar73,auVar71);
        auVar87._4_4_ = uStack_1d8c;
        auVar87._0_4_ = local_1d90;
        auVar87._8_8_ = 0;
        auStack_1b30 = vmovlhps_avx(auVar87,auVar71);
        local_1b20.lower = (float)local_1ec0._0_4_;
        local_1b20.upper = (float)local_1ec0._4_4_;
        local_1ec0 = auVar85;
      }
      this_00 = local_1f28;
      bVar69 = local_1f48 != (BBox1f)0x0;
      findFallback((Split *)local_1d60,local_1f28,(SetMB *)&local_1cc0[0].field_1);
      aVar12._4_4_ = local_1d60._12_4_;
      aVar12._0_4_ = local_1d60._8_4_;
      *local_1f00 = (anon_union_8_2_d71db6ad_for_task_group_context_11)local_1d60._0_8_;
      local_1f00[1] = aVar12;
      local_1c10.upper = aStack_1d50.m128[1];
      local_1c10.lower = aStack_1d50.m128[0];
      local_1c00.upper = (float)local_1d40.i[1];
      local_1c00.lower = (float)local_1d40.i[0];
      BStack_1bf8.upper = (float)local_1d40.i[3];
      BStack_1bf8.lower = (float)local_1d40.i[2];
      BStack_1bf0.upper = (float)aStack_1d30.i[1];
      BStack_1bf0.lower = (float)aStack_1d30.i[0];
      BStack_1be8.upper = (float)aStack_1d30.i[3];
      BStack_1be8.lower = (float)aStack_1d30.i[2];
      findFallback((Split *)local_1d60,this_00,(SetMB *)(auStack_1bb8 + 8));
      lVar39 = local_b8;
      aVar20._4_4_ = local_1d60._12_4_;
      aVar20._0_4_ = local_1d60._8_4_;
      *local_1e90 = (anon_union_8_2_d71db6ad_for_task_group_context_11)local_1d60._0_8_;
      local_1e90[1] = aVar20;
      local_1b00._4_4_ = aStack_1d50.m128[1];
      local_1b00._0_4_ = aStack_1d50.m128[0];
      local_1af0._4_4_ = local_1d40.i[1];
      local_1af0._0_4_ = local_1d40.i[0];
      aStack_1ae8._4_4_ = local_1d40.i[3];
      aStack_1ae8._0_4_ = local_1d40.i[2];
      aStack_1ae0._4_4_ = aStack_1d30.i[1];
      aStack_1ae0._0_4_ = aStack_1d30.i[0];
      aStack_1ad8._4_4_ = aStack_1d30.i[3];
      aStack_1ad8._0_4_ = aStack_1d30.i[2];
      local_1f48.lower = 0.0;
      local_1f48.upper = 0.0;
      pBVar51 = local_340[uVar68];
      if (local_1c30 == *pBVar51) {
        pBVar51[1] = (BBox1f)((long)pBVar51[1] + 1);
      }
      else {
        local_b8 = local_b8 + 1;
        local_2b0[lVar39 * 2 + -1] = local_1c30;
        local_2b0[lVar39 * 2].lower = 1.4013e-45;
        local_2b0[lVar39 * 2].upper = 0.0;
        local_340[uVar68] = local_2b0 + lVar39 * 2 + -1;
      }
      lVar39 = local_b8;
      if (local_1b20 == *pBVar51) {
        local_340[local_2c0] = pBVar51;
        pBVar51[1] = (BBox1f)((long)pBVar51[1] + 1);
      }
      else {
        local_b8 = local_b8 + 1;
        local_2b0[lVar39 * 2 + -1] = local_1b20;
        local_2b0[lVar39 * 2].lower = 1.4013e-45;
        local_2b0[lVar39 * 2].upper = 0.0;
        local_340[local_2c0] = local_2b0 + lVar39 * 2 + -1;
      }
      pBVar14 = pBVar51 + 1;
      *pBVar14 = (BBox1f)((long)*pBVar14 + -1);
      if ((*pBVar14 == (BBox1f)0x0) && (BVar40 = *pBVar51, BVar40 != (BBox1f)0x0)) {
        lVar39 = *(long *)((long)BVar40 + 0x18);
        pvVar41 = *(void **)((long)BVar40 + 0x20);
        if (pvVar41 != (void *)0x0) {
          local_1ec0._0_8_ = lVar39;
          if ((ulong)(lVar39 * 0x50) < 0x1c00000) {
            alignedFree(pvVar41);
            lVar39 = local_1ec0._0_8_;
          }
          else {
            os_free(pvVar41,lVar39 * 0x50,*(bool *)((long)BVar40 + 8));
            lVar39 = local_1ec0._0_8_;
          }
        }
        if (lVar39 != 0) {
          (**(code **)**(undefined8 **)BVar40)(*(undefined8 **)BVar40,lVar39 * -0x50,1);
        }
        *(undefined8 *)((long)BVar40 + 0x10) = 0;
        *(undefined8 *)((long)BVar40 + 0x18) = 0;
        *(undefined8 *)((long)BVar40 + 0x20) = 0;
        operator_delete((void *)BVar40);
      }
      uVar42 = local_2c0;
      auVar73 = auStack_1b30;
      auVar71 = auStack_1c40;
      ((BBox1f *)local_1f40._0_8_)->lower = (float)local_1cd0._0_4_;
      ((BBox1f *)local_1f40._0_8_)->upper = (float)local_1cd0._4_4_;
      *(undefined8 *)(local_1f40._0_8_ + 0x10) = local_1cc0[0]._0_8_;
      ((BBox1f *)(local_1f40._0_8_ + 0x18))->lower = (float)local_1cc0[0]._8_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x18))->upper = (float)local_1cc0[0]._12_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x20))->lower = (float)local_1cc0[1]._0_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x20))->upper = (float)local_1cc0[1]._4_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x28))->lower = (float)local_1cc0[1]._8_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x28))->upper = (float)local_1cc0[1]._12_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x30))->lower = (float)local_1cc0[2]._0_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x30))->upper = (float)local_1cc0[2]._4_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x38))->lower = (float)local_1cc0[2]._8_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x38))->upper = (float)local_1cc0[2]._12_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x40))->lower = (float)local_1cc0[3]._0_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x40))->upper = (float)local_1cc0[3]._4_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x48))->lower = (float)local_1cc0[3]._8_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x48))->upper = (float)local_1cc0[3]._12_4_;
      *(BBox1f *)(local_1f40._0_8_ + 0x50) = local_1c80;
      *(BBox1f *)(local_1f40._0_8_ + 0x58) = BStack_1c78;
      *(BBox1f *)(local_1f40._0_8_ + 0x60) = BStack_1c70;
      *(BBox1f *)(local_1f40._0_8_ + 0x68) = BStack_1c68;
      *(BBox1f *)(local_1f40._0_8_ + 0x70) = local_1c60;
      *(BBox1f *)(local_1f40._0_8_ + 0x78) = BStack_1c58;
      *(BBox1f *)(local_1f40._0_8_ + 0x80) = BStack_1c50;
      *(BBox1f *)(local_1f40._0_8_ + 0x88) = BStack_1c48;
      ((BBox1f *)(local_1f40._0_8_ + 0x90))->lower = (float)auStack_1c40._0_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x90))->upper = (float)auStack_1c40._4_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x98))->lower = (float)auStack_1c40._8_4_;
      ((BBox1f *)(local_1f40._0_8_ + 0x98))->upper = (float)auStack_1c40._12_4_;
      *(BBox1f *)(local_1f40._0_8_ + 0xa0) = local_1c30;
      aVar12 = local_1f00[1];
      *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)local_1ef0._0_8_ = *local_1f00;
      *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)(local_1ef0._0_8_ + 8) = aVar12;
      *(BBox1f *)(local_1f40._0_8_ + 0xc0) = local_1c10;
      *(BBox1f *)(local_1f40._0_8_ + 0xd0) = local_1c00;
      *(BBox1f *)(local_1f40._0_8_ + 0xd8) = BStack_1bf8;
      *(BBox1f *)(local_1f40._0_8_ + 0xe0) = BStack_1bf0;
      *(BBox1f *)(local_1f40._0_8_ + 0xe8) = BStack_1be8;
      lVar39 = local_2c0 * 0xf0;
      (&local_1240)[local_2c0 * 0x1e] =
           (anon_union_8_2_d71db6ad_for_task_group_context_11)local_1bc8._8_8_;
      (&aStack_1230)[uVar42 * 0x1e] =
           (anon_union_8_2_d71db6ad_for_task_group_context_11)stack0xffffffffffffe450;
      (&BStack_1228)[uVar42 * 0x1e].lower = (float)aStack_1ba8._0_4_;
      (&BStack_1228)[uVar42 * 0x1e].upper = aStack_1ba8.m128[1];
      *(undefined8 *)(&local_1220 + uVar42 * 0xf) = aStack_1ba8._8_8_;
      *(undefined8 *)((long)&local_1220 + lVar39 + 8) = aStack_1b98._0_8_;
      *(undefined8 *)(&aStack_1210 + uVar42 * 0xf) = aStack_1b98._8_8_;
      *(undefined8 *)((long)&aStack_1210 + lVar39 + 8) = aStack_1b88._0_8_;
      *(undefined8 *)(local_1200 + uVar42 * 0xf0) = aStack_1b88._8_8_;
      *(unsigned_long *)(local_1200 + lVar39 + 8) = uStack_1b78;
      *(unsigned_long *)(local_11f0 + uVar42 * 0xf0) = local_1b70;
      *(size_t *)(local_11f0 + lVar39 + 8) = sStack_1b68;
      *(size_t *)(local_11e0 + uVar42 * 0xf0) = sStack_1b60;
      *(BBox1f *)(local_11e0 + lVar39 + 8) = BStack_1b58;
      (&local_11d0)[uVar42 * 0x1e] = local_1b50;
      *(size_t *)(&uStack_11c8 + uVar42 * 0x3c) = sStack_1b48;
      (&BStack_11c0)[uVar42 * 0x1e] = BStack_1b40;
      (&sStack_11b8)[uVar42 * 0x1e] = sStack_1b38;
      (&local_11b0)[uVar42 * 0x1e].lower = (float)auStack_1b30._0_4_;
      (&local_11b0)[uVar42 * 0x1e].upper = (float)auStack_1b30._4_4_;
      local_11a0[uVar42 * 0x1e + -1].lower = (float)auStack_1b30._8_4_;
      local_11a0[uVar42 * 0x1e + -1].upper = (float)auStack_1b30._12_4_;
      local_11a0[uVar42 * 0x1e] = local_1b20;
      aVar12 = local_1e90[1];
      *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)(&local_1190 + uVar42 * 0xf) =
           *local_1e90;
      local_1180[uVar42 * 0x1e + -1] = aVar12;
      local_1180[uVar42 * 0x1e] = local_1b00;
      local_1180[uVar42 * 0x1e + 2] = local_1af0;
      local_1180[uVar42 * 0x1e + 3] = aStack_1ae8;
      local_1180[uVar42 * 0x1e + 4] = aStack_1ae0;
      local_1180[uVar42 * 0x1e + 5] = aStack_1ad8;
      local_2c0 = local_2c0 + 1;
      auStack_1c40 = auVar71;
      auStack_1b30 = auVar73;
      if (local_1f48 != (BBox1f)0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&local_1f48,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)local_1f48);
      }
      local_1eb0 = (uint)CONCAT71((int7)(CONCAT44(uStack_1eac,local_1eb0) >> 8),
                                  (byte)local_1eb0 | bVar69);
      this = local_1f28;
    }
  } while ((uVar68 != 0xffffffffffffffff) && (local_2c0 < (this->cfg).branchingFactor));
  if (local_2c0 == 0) {
    uVar68 = CONCAT44(uStack_1eac,local_1eb0);
  }
  else {
    puVar53 = &uStack_11a4;
    uVar68 = CONCAT44(uStack_1eac,local_1eb0);
    uVar42 = local_2c0;
    do {
      auVar71 = vcmpps_avx(ZEXT416(*(uint *)(local_1ad0._0_8_ + 0x98)),ZEXT416(puVar53[-1]),1);
      auVar73 = vcmpps_avx(ZEXT416(*puVar53),ZEXT416(*(uint *)(local_1ad0._0_8_ + 0x9c)),1);
      auVar71 = vorps_avx(auVar71,auVar73);
      uVar68 = CONCAT71((int7)(uVar68 >> 8),(byte)uVar68 | auVar71[0]);
      puVar53 = puVar53 + 0x3c;
      uVar42 = uVar42 - 1;
    } while (uVar42 != 0);
  }
  local_1eb0 = (uint)uVar68;
  uStack_1eac = (undefined4)(uVar68 >> 0x20);
  if ((uVar68 & 1) == 0) {
    local_1e10.m128[0] = 3.13891e-43;
    local_1e10.m128[1] = 0.0;
    aVar12 = (anon_union_8_2_d71db6ad_for_task_group_context_11)(alloc.talloc0)->parent;
    if (alloc.alloc !=
        (((atomic<embree::FastAllocator_*> *)&(aVar12.my_parent)->my_cancellation_requested)->_M_b).
        _M_p) {
      auStack_1bb8[0] = 1;
      local_1bc8._8_8_ = aVar12;
      MutexSys::lock((MutexSys *)aVar12.my_parent);
      if ((((atomic<embree::FastAllocator_*> *)&(aVar12.my_parent)->my_cancellation_requested)->_M_b
          )._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)
                    &(aVar12.my_parent)->my_cancellation_requested)->_M_b)._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (long)&(aVar12.my_parent[1].my_node.my_next_node)->my_prev_node +
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             *(size_t *)((long)(aVar12.my_parent)->padding + 0x20);
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)
                    &(aVar12.my_parent)->my_cancellation_requested)->_M_b)._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (__int_type_conflict)
             (aVar12.my_parent[1].my_context_list +
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (*(size_t *)((long)(aVar12.my_parent)->padding + 0x10) -
             (long)((aVar12.my_parent[1].field_6.my_parent)->padding +
                   (*(size_t *)((long)(aVar12.my_parent)->padding + 8) - 0x48))));
        UNLOCK();
        LOCK();
        paVar1 = &((((atomic<embree::FastAllocator_*> *)
                    &(aVar12.my_parent)->my_cancellation_requested)->_M_b)._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (__int_type_conflict)
             (aVar12.my_parent[1].my_exception._M_b._M_p +
             *(size_t *)((long)(aVar12.my_parent)->padding + 0x28) +
             (paVar1->super___atomic_base<unsigned_long>)._M_i);
        UNLOCK();
      }
      auVar71 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])((long)(aVar12.my_parent)->padding + 0x10) = ZEXT1632(auVar71);
      *(undefined1 (*) [32])(aVar12.my_parent)->padding = ZEXT1632(auVar71);
      auVar78 = ZEXT1632(auVar71);
      if (alloc.alloc == (FastAllocator *)0x0) {
        ((task_group_context *)((long)aVar12 + 0x80))->my_context_list =
             (context_list *)auVar78._0_8_;
        (((task_group_context *)((long)aVar12 + 0x80))->my_node).my_prev_node =
             (intrusive_list_node *)SUB168(auVar78._8_16_,0);
        (((task_group_context *)((long)aVar12 + 0x80))->my_node).my_next_node =
             (intrusive_list_node *)SUB168(auVar78._8_16_,8);
        ((task_group_context *)((long)aVar12 + 0x80))->my_exception =
             (atomic<tbb::detail::r1::tbb_exception_ptr_*>)auVar78._24_8_;
        ((task_group_context *)((long)aVar12 + 0x80))->my_cancellation_requested =
             (atomic<unsigned_int>)auVar78._0_4_;
        ((task_group_context *)((long)aVar12 + 0x80))->my_version = auVar78[4];
        ((task_group_context *)((long)aVar12 + 0x80))->my_traits = (context_traits)auVar78[5];
        ((task_group_context *)((long)aVar12 + 0x80))->my_state = (atomic<unsigned_char>)auVar78[6];
        ((task_group_context *)((long)aVar12 + 0x80))->my_lifetime_state =
             (atomic<tbb::detail::d1::task_group_context::lifetime_state>)auVar78[7];
        ((task_group_context *)((long)aVar12 + 0x80))->field_6 =
             (anon_union_8_2_d71db6ad_for_task_group_context_11)auVar78._8_8_;
        ((task_group_context *)((long)aVar12 + 0x80))->my_context_list =
             (context_list *)auVar78._16_8_;
        (((task_group_context *)((long)aVar12 + 0x80))->my_node).my_prev_node =
             (intrusive_list_node *)auVar78._24_8_;
      }
      else {
        *(size_t *)((long)(aVar12.my_parent)->padding + 0x18) = (alloc.alloc)->defaultBlockSize;
        ((task_group_context *)((long)aVar12 + 0x80))->my_cancellation_requested =
             (atomic<unsigned_int>)auVar78._0_4_;
        ((task_group_context *)((long)aVar12 + 0x80))->my_version = auVar78[4];
        ((task_group_context *)((long)aVar12 + 0x80))->my_traits = (context_traits)auVar78[5];
        ((task_group_context *)((long)aVar12 + 0x80))->my_state = (atomic<unsigned_char>)auVar78[6];
        ((task_group_context *)((long)aVar12 + 0x80))->my_lifetime_state =
             (atomic<tbb::detail::d1::task_group_context::lifetime_state>)auVar78[7];
        ((task_group_context *)((long)aVar12 + 0x80))->field_6 =
             (anon_union_8_2_d71db6ad_for_task_group_context_11)auVar78._8_8_;
        ((task_group_context *)((long)aVar12 + 0x80))->my_context_list =
             (context_list *)auVar78._16_8_;
        (((task_group_context *)((long)aVar12 + 0x80))->my_node).my_prev_node =
             (intrusive_list_node *)auVar78._24_8_;
        ((task_group_context *)((long)aVar12 + 0x80))->my_context_list =
             (context_list *)auVar78._0_8_;
        (((task_group_context *)((long)aVar12 + 0x80))->my_node).my_prev_node =
             (intrusive_list_node *)SUB168(auVar78._8_16_,0);
        (((task_group_context *)((long)aVar12 + 0x80))->my_node).my_next_node =
             (intrusive_list_node *)SUB168(auVar78._8_16_,8);
        ((task_group_context *)((long)aVar12 + 0x80))->my_exception =
             (atomic<tbb::detail::r1::tbb_exception_ptr_*>)auVar78._24_8_;
        aVar12.my_parent[1].my_node.my_prev_node =
             (intrusive_list_node *)(alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (((atomic<embree::FastAllocator_*> *)&(aVar12.my_parent)->my_cancellation_requested)->_M_b).
      _M_p = alloc.alloc;
      UNLOCK();
      local_1cd0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      local_1cd0[8] = 1;
      local_1d60._0_8_ = aVar12;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar13._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar13._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar13,(ThreadLocal2 **)local_1d60);
      }
      else {
        *iVar13._M_current = (ThreadLocal2 *)local_1d60._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (local_1cd0[8] == '\x01') {
        MutexSys::unlock((MutexSys *)local_1cd0._0_8_);
      }
      if (auStack_1bb8[0] == '\x01') {
        MutexSys::unlock((MutexSys *)local_1bc8._8_8_);
      }
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + local_1e10._0_8_;
    sVar47 = (alloc.talloc0)->cur;
    uVar68 = (ulong)(-(int)sVar47 & 0xf);
    uVar42 = sVar47 + local_1e10._0_8_ + uVar68;
    (alloc.talloc0)->cur = uVar42;
    if ((alloc.talloc0)->end < uVar42) {
      (alloc.talloc0)->cur = sVar47;
      if ((alloc.talloc0)->allocBlockSize < (ulong)(local_1e10._0_8_ << 2)) {
        pcVar65 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1e10);
      }
      else {
        local_1cd0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar65 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cd0);
        (alloc.talloc0)->ptr = pcVar65;
        sVar47 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar47;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = local_1cd0._0_8_;
        (alloc.talloc0)->cur = local_1e10._0_8_;
        if ((ulong)local_1cd0._0_8_ < (ulong)local_1e10._0_8_) {
          (alloc.talloc0)->cur = 0;
          local_1cd0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar65 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cd0);
          (alloc.talloc0)->ptr = pcVar65;
          sVar47 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar47;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = local_1cd0._0_8_;
          (alloc.talloc0)->cur = local_1e10._0_8_;
          if ((ulong)local_1cd0._0_8_ < (ulong)local_1e10._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar65 = (char *)0x0;
            goto LAB_0145ea30;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar47;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar68;
      pcVar65 = (alloc.talloc0)->ptr + (uVar42 - local_1e10._0_8_);
    }
LAB_0145ea30:
    local_1f00._0_4_ = 1;
    goto LAB_0145ea35;
  }
  local_1e10.m128[0] = 3.58732e-43;
  local_1e10.m128[1] = 0.0;
  aVar12 = (anon_union_8_2_d71db6ad_for_task_group_context_11)(alloc.talloc0)->parent;
  if (alloc.alloc !=
      (((atomic<embree::FastAllocator_*> *)&(aVar12.my_parent)->my_cancellation_requested)->_M_b).
      _M_p) {
    auStack_1bb8[0] = 1;
    local_1bc8._8_8_ = aVar12;
    MutexSys::lock((MutexSys *)aVar12.my_parent);
    if ((((atomic<embree::FastAllocator_*> *)&(aVar12.my_parent)->my_cancellation_requested)->_M_b).
        _M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)&(aVar12.my_parent)->my_cancellation_requested
                  )->_M_b)._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (long)&(aVar12.my_parent[1].my_node.my_next_node)->my_prev_node +
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           *(size_t *)((long)(aVar12.my_parent)->padding + 0x20);
      UNLOCK();
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)&(aVar12.my_parent)->my_cancellation_requested
                  )->_M_b)._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (__int_type_conflict)
           (aVar12.my_parent[1].my_context_list +
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (*(size_t *)((long)(aVar12.my_parent)->padding + 0x10) -
           (long)((aVar12.my_parent[1].field_6.my_parent)->padding +
                 (*(size_t *)((long)(aVar12.my_parent)->padding + 8) - 0x48))));
      UNLOCK();
      LOCK();
      paVar1 = &((((atomic<embree::FastAllocator_*> *)&(aVar12.my_parent)->my_cancellation_requested
                  )->_M_b)._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (__int_type_conflict)
           (aVar12.my_parent[1].my_exception._M_b._M_p +
           *(size_t *)((long)(aVar12.my_parent)->padding + 0x28) +
           (paVar1->super___atomic_base<unsigned_long>)._M_i);
      UNLOCK();
    }
    auVar71 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])((long)(aVar12.my_parent)->padding + 0x10) = ZEXT1632(auVar71);
    *(undefined1 (*) [32])(aVar12.my_parent)->padding = ZEXT1632(auVar71);
    auVar78 = ZEXT1632(auVar71);
    if (alloc.alloc == (FastAllocator *)0x0) {
      ((task_group_context *)((long)aVar12 + 0x80))->my_context_list = (context_list *)auVar78._0_8_
      ;
      (((task_group_context *)((long)aVar12 + 0x80))->my_node).my_prev_node =
           (intrusive_list_node *)SUB168(auVar78._8_16_,0);
      (((task_group_context *)((long)aVar12 + 0x80))->my_node).my_next_node =
           (intrusive_list_node *)SUB168(auVar78._8_16_,8);
      ((task_group_context *)((long)aVar12 + 0x80))->my_exception =
           (atomic<tbb::detail::r1::tbb_exception_ptr_*>)auVar78._24_8_;
      ((task_group_context *)((long)aVar12 + 0x80))->my_cancellation_requested =
           (atomic<unsigned_int>)auVar78._0_4_;
      ((task_group_context *)((long)aVar12 + 0x80))->my_version = auVar78[4];
      ((task_group_context *)((long)aVar12 + 0x80))->my_traits = (context_traits)auVar78[5];
      ((task_group_context *)((long)aVar12 + 0x80))->my_state = (atomic<unsigned_char>)auVar78[6];
      ((task_group_context *)((long)aVar12 + 0x80))->my_lifetime_state =
           (atomic<tbb::detail::d1::task_group_context::lifetime_state>)auVar78[7];
      ((task_group_context *)((long)aVar12 + 0x80))->field_6 =
           (anon_union_8_2_d71db6ad_for_task_group_context_11)auVar78._8_8_;
      ((task_group_context *)((long)aVar12 + 0x80))->my_context_list =
           (context_list *)auVar78._16_8_;
      (((task_group_context *)((long)aVar12 + 0x80))->my_node).my_prev_node =
           (intrusive_list_node *)auVar78._24_8_;
    }
    else {
      *(size_t *)((long)(aVar12.my_parent)->padding + 0x18) = (alloc.alloc)->defaultBlockSize;
      ((task_group_context *)((long)aVar12 + 0x80))->my_cancellation_requested =
           (atomic<unsigned_int>)auVar78._0_4_;
      ((task_group_context *)((long)aVar12 + 0x80))->my_version = auVar78[4];
      ((task_group_context *)((long)aVar12 + 0x80))->my_traits = (context_traits)auVar78[5];
      ((task_group_context *)((long)aVar12 + 0x80))->my_state = (atomic<unsigned_char>)auVar78[6];
      ((task_group_context *)((long)aVar12 + 0x80))->my_lifetime_state =
           (atomic<tbb::detail::d1::task_group_context::lifetime_state>)auVar78[7];
      ((task_group_context *)((long)aVar12 + 0x80))->field_6 =
           (anon_union_8_2_d71db6ad_for_task_group_context_11)auVar78._8_8_;
      ((task_group_context *)((long)aVar12 + 0x80))->my_context_list =
           (context_list *)auVar78._16_8_;
      (((task_group_context *)((long)aVar12 + 0x80))->my_node).my_prev_node =
           (intrusive_list_node *)auVar78._24_8_;
      ((task_group_context *)((long)aVar12 + 0x80))->my_context_list = (context_list *)auVar78._0_8_
      ;
      (((task_group_context *)((long)aVar12 + 0x80))->my_node).my_prev_node =
           (intrusive_list_node *)SUB168(auVar78._8_16_,0);
      (((task_group_context *)((long)aVar12 + 0x80))->my_node).my_next_node =
           (intrusive_list_node *)SUB168(auVar78._8_16_,8);
      ((task_group_context *)((long)aVar12 + 0x80))->my_exception =
           (atomic<tbb::detail::r1::tbb_exception_ptr_*>)auVar78._24_8_;
      aVar12.my_parent[1].my_node.my_prev_node =
           (intrusive_list_node *)(alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (((atomic<embree::FastAllocator_*> *)&(aVar12.my_parent)->my_cancellation_requested)->_M_b)._M_p
         = alloc.alloc;
    UNLOCK();
    local_1cd0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    local_1cd0[8] = 1;
    local_1d60._0_8_ = aVar12;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar13._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar13,(ThreadLocal2 **)local_1d60);
    }
    else {
      *iVar13._M_current = (ThreadLocal2 *)local_1d60._0_8_;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (local_1cd0[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_1cd0._0_8_);
    }
    if (auStack_1bb8[0] == '\x01') {
      MutexSys::unlock((MutexSys *)local_1bc8._8_8_);
    }
  }
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + local_1e10._0_8_;
  sVar47 = (alloc.talloc0)->cur;
  uVar68 = (ulong)(-(int)sVar47 & 0xf);
  uVar42 = sVar47 + local_1e10._0_8_ + uVar68;
  (alloc.talloc0)->cur = uVar42;
  if ((alloc.talloc0)->end < uVar42) {
    (alloc.talloc0)->cur = sVar47;
    if ((alloc.talloc0)->allocBlockSize < (ulong)(local_1e10._0_8_ << 2)) {
      pcVar65 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1e10);
    }
    else {
      local_1cd0._0_8_ = (alloc.talloc0)->allocBlockSize;
      pcVar65 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cd0);
      (alloc.talloc0)->ptr = pcVar65;
      sVar47 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar47;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = local_1cd0._0_8_;
      (alloc.talloc0)->cur = local_1e10._0_8_;
      if ((ulong)local_1cd0._0_8_ < (ulong)local_1e10._0_8_) {
        (alloc.talloc0)->cur = 0;
        local_1cd0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar65 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1cd0);
        (alloc.talloc0)->ptr = pcVar65;
        sVar47 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar47;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = local_1cd0._0_8_;
        (alloc.talloc0)->cur = local_1e10._0_8_;
        if ((ulong)local_1cd0._0_8_ < (ulong)local_1e10._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar65 = (char *)0x0;
          goto LAB_0145e98a;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar47;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar68;
    pcVar65 = (alloc.talloc0)->ptr + (uVar42 - local_1e10._0_8_);
  }
LAB_0145e98a:
  pcVar65[0xe0] = '\0';
  pcVar65[0xe1] = '\0';
  pcVar65[0xe2] = -0x80;
  pcVar65[0xe3] = '\x7f';
  pcVar65[0xe4] = '\0';
  pcVar65[0xe5] = '\0';
  pcVar65[0xe6] = -0x80;
  pcVar65[0xe7] = '\x7f';
  pcVar65[0xe8] = '\0';
  pcVar65[0xe9] = '\0';
  pcVar65[0xea] = -0x80;
  pcVar65[0xeb] = '\x7f';
  pcVar65[0xec] = '\0';
  pcVar65[0xed] = '\0';
  pcVar65[0xee] = -0x80;
  pcVar65[0xef] = '\x7f';
  pcVar65[0xf0] = '\0';
  pcVar65[0xf1] = '\0';
  pcVar65[0xf2] = -0x80;
  pcVar65[0xf3] = -1;
  pcVar65[0xf4] = '\0';
  pcVar65[0xf5] = '\0';
  pcVar65[0xf6] = -0x80;
  pcVar65[0xf7] = -1;
  pcVar65[0xf8] = '\0';
  pcVar65[0xf9] = '\0';
  pcVar65[0xfa] = -0x80;
  pcVar65[0xfb] = -1;
  pcVar65[0xfc] = '\0';
  pcVar65[0xfd] = '\0';
  pcVar65[0xfe] = -0x80;
  pcVar65[0xff] = -1;
  local_1f00._0_4_ = 6;
LAB_0145ea35:
  local_1f00._4_4_ = 0;
  pcVar65[0x60] = '\0';
  pcVar65[0x61] = '\0';
  pcVar65[0x62] = -0x80;
  pcVar65[99] = '\x7f';
  pcVar65[100] = '\0';
  pcVar65[0x65] = '\0';
  pcVar65[0x66] = -0x80;
  pcVar65[0x67] = '\x7f';
  pcVar65[0x68] = '\0';
  pcVar65[0x69] = '\0';
  pcVar65[0x6a] = -0x80;
  pcVar65[0x6b] = '\x7f';
  pcVar65[0x6c] = '\0';
  pcVar65[0x6d] = '\0';
  pcVar65[0x6e] = -0x80;
  pcVar65[0x6f] = '\x7f';
  pcVar65[0x40] = '\0';
  pcVar65[0x41] = '\0';
  pcVar65[0x42] = -0x80;
  pcVar65[0x43] = '\x7f';
  pcVar65[0x44] = '\0';
  pcVar65[0x45] = '\0';
  pcVar65[0x46] = -0x80;
  pcVar65[0x47] = '\x7f';
  pcVar65[0x48] = '\0';
  pcVar65[0x49] = '\0';
  pcVar65[0x4a] = -0x80;
  pcVar65[0x4b] = '\x7f';
  pcVar65[0x4c] = '\0';
  pcVar65[0x4d] = '\0';
  pcVar65[0x4e] = -0x80;
  pcVar65[0x4f] = '\x7f';
  pcVar65[0x20] = '\0';
  pcVar65[0x21] = '\0';
  pcVar65[0x22] = -0x80;
  pcVar65[0x23] = '\x7f';
  pcVar65[0x24] = '\0';
  pcVar65[0x25] = '\0';
  pcVar65[0x26] = -0x80;
  pcVar65[0x27] = '\x7f';
  pcVar65[0x28] = '\0';
  pcVar65[0x29] = '\0';
  pcVar65[0x2a] = -0x80;
  pcVar65[0x2b] = '\x7f';
  pcVar65[0x2c] = '\0';
  pcVar65[0x2d] = '\0';
  pcVar65[0x2e] = -0x80;
  pcVar65[0x2f] = '\x7f';
  local_1f40.i[2] = 0xff800000;
  local_1f40._0_8_ = 0xff800000ff800000;
  local_1f40.i[3] = 0xff800000;
  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar65 + 0x70) = local_1f40;
  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar65 + 0x50) = local_1f40;
  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(pcVar65 + 0x30) = local_1f40;
  auVar71 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])(pcVar65 + 0x80) = ZEXT1632(auVar71);
  *(undefined1 (*) [32])(pcVar65 + 0xa0) = ZEXT1632(auVar71);
  *(undefined1 (*) [32])(pcVar65 + 0xc0) = ZEXT1632(auVar71);
  pcVar65[0] = '\b';
  pcVar65[1] = '\0';
  pcVar65[2] = '\0';
  pcVar65[3] = '\0';
  pcVar65[4] = '\0';
  pcVar65[5] = '\0';
  pcVar65[6] = '\0';
  pcVar65[7] = '\0';
  pcVar65[8] = '\b';
  pcVar65[9] = '\0';
  pcVar65[10] = '\0';
  pcVar65[0xb] = '\0';
  pcVar65[0xc] = '\0';
  pcVar65[0xd] = '\0';
  pcVar65[0xe] = '\0';
  pcVar65[0xf] = '\0';
  pcVar65[0x10] = '\b';
  pcVar65[0x11] = '\0';
  pcVar65[0x12] = '\0';
  pcVar65[0x13] = '\0';
  pcVar65[0x14] = '\0';
  pcVar65[0x15] = '\0';
  pcVar65[0x16] = '\0';
  pcVar65[0x17] = '\0';
  pcVar65[0x18] = '\b';
  pcVar65[0x19] = '\0';
  pcVar65[0x1a] = '\0';
  pcVar65[0x1b] = '\0';
  pcVar65[0x1c] = '\0';
  pcVar65[0x1d] = '\0';
  pcVar65[0x1e] = '\0';
  pcVar65[0x1f] = '\0';
  local_1ef0.i[2] = 0x7f800000;
  local_1ef0._0_8_ = 0x7f8000007f800000;
  local_1ef0.i[3] = 0x7f800000;
  in_00 = &local_1240;
  if (local_2c0 != 0) {
    pBVar51 = &local_17f0;
    uVar68 = 0;
    local_1ef0.i[2] = 0x7f800000;
    local_1ef0._0_8_ = 0x7f8000007f800000;
    local_1ef0.i[3] = 0x7f800000;
    local_1ee0._8_4_ = 0x7f800000;
    local_1ee0._0_8_ = 0x7f8000007f800000;
    uStack_1ed4 = INFINITY;
    local_1f40.i[2] = 0xff800000;
    local_1f40._0_8_ = 0xff800000ff800000;
    local_1f40.i[3] = 0xff800000;
    local_1f20._end._0_4_ = 0xff800000;
    local_1f20._begin = 0xff800000ff800000;
    local_1f20._end._4_4_ = 0xff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)local_1cd0,local_1f28,(BuildRecord *)in_00,alloc);
      pBVar51[-10].lower = (float)local_1cd0._0_4_;
      pBVar51[-10].upper = (float)local_1cd0._4_4_;
      auVar21._8_8_ = local_1cc0[0]._8_8_;
      auVar21._0_8_ = local_1cc0[0]._0_8_;
      *(undefined1 (*) [16])(pBVar51 + -8) = auVar21;
      pBVar51[-6].lower = (float)local_1cc0[1]._0_4_;
      pBVar51[-6].upper = (float)local_1cc0[1]._4_4_;
      pBVar51[-5].lower = (float)local_1cc0[1]._8_4_;
      pBVar51[-5].upper = (float)local_1cc0[1]._12_4_;
      pBVar51[-4].lower = (float)local_1cc0[2]._0_4_;
      pBVar51[-4].upper = (float)local_1cc0[2]._4_4_;
      pBVar51[-3].lower = (float)local_1cc0[2]._8_4_;
      pBVar51[-3].upper = (float)local_1cc0[2]._12_4_;
      pBVar51[-2].lower = (float)local_1cc0[3]._0_4_;
      pBVar51[-2].upper = (float)local_1cc0[3]._4_4_;
      pBVar51[-1].lower = (float)local_1cc0[3]._8_4_;
      pBVar51[-1].upper = (float)local_1cc0[3]._12_4_;
      *pBVar51 = local_1c80;
      local_1f40.v = (__m128)vmaxps_avx(local_1f40.v,*(undefined1 (*) [16])(pBVar51 + -6));
      _local_1ee0 = vminps_avx(_local_1ee0,*(undefined1 (*) [16])(pBVar51 + -4));
      local_1ef0.v = (__m128)vminps_avx(local_1ef0.v,auVar21);
      local_1f20 = (range<unsigned_long>)
                   vmaxps_avx((undefined1  [16])local_1f20,*(undefined1 (*) [16])(pBVar51 + -2));
      uVar68 = uVar68 + 1;
      pBVar51 = pBVar51 + 0xc;
      in_00 = in_00 + 0x1e;
    } while (uVar68 < local_2c0);
  }
  uVar68 = CONCAT44(local_1f00._4_4_,(undefined4)local_1f00) | (ulong)pcVar65;
  if (((uint)uVar68 & 0xf) == 1) {
    if (local_2c0 != 0) {
      uVar58 = (ulong)pcVar65 & 0xfffffffffffffff0;
      pfVar43 = &local_17f0.upper;
      uVar42 = 0;
      auVar94._8_4_ = 0x7f7fffff;
      auVar94._0_8_ = 0x7f7fffff7f7fffff;
      auVar94._12_4_ = 0x7f7fffff;
      auVar101._8_4_ = 0xff7fffff;
      auVar101._0_8_ = 0xff7fffffff7fffff;
      auVar101._12_4_ = 0xff7fffff;
      auVar104._8_4_ = 0x7fffffff;
      auVar104._0_8_ = 0x7fffffff7fffffff;
      auVar104._12_4_ = 0x7fffffff;
      do {
        *(undefined8 *)(uVar58 + uVar42 * 8) = *(undefined8 *)(pfVar43 + -0x15);
        fVar4 = ((BBox1f *)(pfVar43 + -1))->lower;
        fVar115 = 1.0 / (*pfVar43 - fVar4);
        fVar18 = -fVar4 * fVar115;
        auVar71 = vshufps_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18),0);
        auVar73 = vshufps_avx(ZEXT416((uint)(1.0 - fVar18)),ZEXT416((uint)(1.0 - fVar18)),0);
        auVar166._0_4_ = pfVar43[-9] * auVar71._0_4_ + pfVar43[-0x11] * auVar73._0_4_;
        auVar166._4_4_ = pfVar43[-8] * auVar71._4_4_ + pfVar43[-0x10] * auVar73._4_4_;
        auVar166._8_4_ = pfVar43[-7] * auVar71._8_4_ + pfVar43[-0xf] * auVar73._8_4_;
        auVar166._12_4_ = pfVar43[-6] * auVar71._12_4_ + pfVar43[-0xe] * auVar73._12_4_;
        auVar134._0_4_ = pfVar43[-5] * auVar71._0_4_ + pfVar43[-0xd] * auVar73._0_4_;
        auVar134._4_4_ = pfVar43[-4] * auVar71._4_4_ + pfVar43[-0xc] * auVar73._4_4_;
        auVar134._8_4_ = pfVar43[-3] * auVar71._8_4_ + pfVar43[-0xb] * auVar73._8_4_;
        auVar134._12_4_ = pfVar43[-2] * auVar71._12_4_ + pfVar43[-10] * auVar73._12_4_;
        fVar115 = (1.0 - fVar4) * fVar115;
        auVar71 = vshufps_avx(ZEXT416((uint)fVar115),ZEXT416((uint)fVar115),0);
        auVar73 = vshufps_avx(ZEXT416((uint)(1.0 - fVar115)),ZEXT416((uint)(1.0 - fVar115)),0);
        auVar144._0_4_ = pfVar43[-9] * auVar71._0_4_ + pfVar43[-0x11] * auVar73._0_4_;
        auVar144._4_4_ = pfVar43[-8] * auVar71._4_4_ + pfVar43[-0x10] * auVar73._4_4_;
        auVar144._8_4_ = pfVar43[-7] * auVar71._8_4_ + pfVar43[-0xf] * auVar73._8_4_;
        auVar144._12_4_ = pfVar43[-6] * auVar71._12_4_ + pfVar43[-0xe] * auVar73._12_4_;
        auVar116._0_4_ = pfVar43[-5] * auVar71._0_4_ + pfVar43[-0xd] * auVar73._0_4_;
        auVar116._4_4_ = pfVar43[-4] * auVar71._4_4_ + pfVar43[-0xc] * auVar73._4_4_;
        auVar116._8_4_ = pfVar43[-3] * auVar71._8_4_ + pfVar43[-0xb] * auVar73._8_4_;
        auVar116._12_4_ = pfVar43[-2] * auVar71._12_4_ + pfVar43[-10] * auVar73._12_4_;
        auVar85 = vminps_avx(auVar166,auVar94);
        auVar73 = vmaxps_avx(auVar134,auVar101);
        auVar99 = vminps_avx(auVar144,auVar94);
        auVar72 = vmaxps_avx(auVar116,auVar101);
        auVar71 = vandps_avx(auVar85,auVar104);
        auVar150._0_4_ = auVar71._0_4_ * 4.7683716e-07;
        auVar150._4_4_ = auVar71._4_4_ * 4.7683716e-07;
        auVar150._8_4_ = auVar71._8_4_ * 4.7683716e-07;
        auVar150._12_4_ = auVar71._12_4_ * 4.7683716e-07;
        auVar85 = vsubps_avx(auVar85,auVar150);
        auVar71 = vandps_avx(auVar73,auVar104);
        auVar135._0_4_ = auVar73._0_4_ + auVar71._0_4_ * 4.7683716e-07;
        auVar135._4_4_ = auVar73._4_4_ + auVar71._4_4_ * 4.7683716e-07;
        auVar135._8_4_ = auVar73._8_4_ + auVar71._8_4_ * 4.7683716e-07;
        auVar135._12_4_ = auVar73._12_4_ + auVar71._12_4_ * 4.7683716e-07;
        auVar71 = vandps_avx(auVar99,auVar104);
        auVar151._0_4_ = auVar71._0_4_ * 4.7683716e-07;
        auVar151._4_4_ = auVar71._4_4_ * 4.7683716e-07;
        auVar151._8_4_ = auVar71._8_4_ * 4.7683716e-07;
        auVar151._12_4_ = auVar71._12_4_ * 4.7683716e-07;
        auVar73 = vsubps_avx(auVar99,auVar151);
        auVar71 = vandps_avx(auVar72,auVar104);
        *(int *)(uVar58 + 0x20 + uVar42 * 4) = auVar85._0_4_;
        uVar63 = vextractps_avx(auVar85,1);
        *(undefined4 *)(uVar58 + 0x40 + uVar42 * 4) = uVar63;
        auVar117._0_4_ = auVar71._0_4_ * 4.7683716e-07 + auVar72._0_4_;
        auVar117._4_4_ = auVar71._4_4_ * 4.7683716e-07 + auVar72._4_4_;
        auVar117._8_4_ = auVar71._8_4_ * 4.7683716e-07 + auVar72._8_4_;
        auVar117._12_4_ = auVar71._12_4_ * 4.7683716e-07 + auVar72._12_4_;
        uVar63 = vextractps_avx(auVar85,2);
        *(undefined4 *)(uVar58 + 0x60 + uVar42 * 4) = uVar63;
        *(float *)(uVar58 + 0x30 + uVar42 * 4) = auVar135._0_4_;
        uVar63 = vextractps_avx(auVar135,1);
        *(undefined4 *)(uVar58 + 0x50 + uVar42 * 4) = uVar63;
        auVar71 = vsubps_avx(auVar73,auVar85);
        uVar63 = vextractps_avx(auVar135,2);
        *(undefined4 *)(uVar58 + 0x70 + uVar42 * 4) = uVar63;
        *(int *)(uVar58 + 0x80 + uVar42 * 4) = auVar71._0_4_;
        uVar63 = vextractps_avx(auVar71,1);
        *(undefined4 *)(uVar58 + 0xa0 + uVar42 * 4) = uVar63;
        auVar73 = vsubps_avx(auVar117,auVar135);
        uVar63 = vextractps_avx(auVar71,2);
        *(undefined4 *)(uVar58 + 0xc0 + uVar42 * 4) = uVar63;
        *(int *)(uVar58 + 0x90 + uVar42 * 4) = auVar73._0_4_;
        uVar63 = vextractps_avx(auVar73,1);
        *(undefined4 *)(uVar58 + 0xb0 + uVar42 * 4) = uVar63;
        uVar63 = vextractps_avx(auVar73,2);
        *(undefined4 *)(uVar58 + 0xd0 + uVar42 * 4) = uVar63;
        uVar42 = uVar42 + 1;
        pfVar43 = pfVar43 + 0x18;
      } while (local_2c0 != uVar42);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<4>,embree::avx::GridRecalculatePrimRef,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::avx::CreateMSMBlurLeafGrid<4>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  BVar34 = BStack_18b8;
  BVar40 = local_18c0;
  if ((local_1eb0 & 1) == 0) {
    (local_1e78->ref).ptr = uVar68;
    *(undefined8 *)&(local_1e78->lbounds).bounds0.lower.field_0 = local_1ef0._0_8_;
    *(undefined8 *)((long)&(local_1e78->lbounds).bounds0.lower.field_0 + 8) = local_1ef0._8_8_;
    *(undefined8 *)&(local_1e78->lbounds).bounds0.upper.field_0 = local_1f40._0_8_;
    *(undefined8 *)((long)&(local_1e78->lbounds).bounds0.upper.field_0 + 8) = local_1f40._8_8_;
    *(undefined8 *)&(local_1e78->lbounds).bounds1.lower.field_0 = local_1ee0._0_8_;
    *(BBox1f *)((long)&(local_1e78->lbounds).bounds1.lower.field_0 + 8) = stack0xffffffffffffe128;
    uVar57 = local_1f20._begin;
    uVar81 = local_1f20._end;
  }
  else {
    register0x00000038 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)&local_1f28->recalculatePrimRef;
    local_19b0._0_8_ = &local_1920;
    local_1bc8._8_8_ = (ThreadLocal2 *)0x7f8000007f800000;
    auStack_1bb8._0_4_ = INFINITY;
    auStack_1bb8._4_4_ = INFINITY;
    stack0xffffffffffffe450 = (task_group_context *)0xff800000ff800000;
    aStack_1ba8.m128[0] = -INFINITY;
    aStack_1ba8.m128[1] = -INFINITY;
    aStack_1ba8._8_8_ = 0x7f8000007f800000;
    aStack_1b98._0_8_ = 0x7f8000007f800000;
    aStack_1b98._8_8_ = 0xff800000ff800000;
    aStack_1b88._0_8_ = 0xff800000ff800000;
    if ((ulong)((long)BStack_18b8 - (long)local_18c0) < 0xc00) {
      local_1cd0._0_4_ = local_18c0.lower;
      local_1cd0._4_4_ = local_18c0.upper;
      stack0xffffffffffffe338 = BStack_18b8;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)local_1d60,(anon_class_16_2_aeee9775 *)local_19b0,
                 (range<unsigned_long> *)local_1cd0);
    }
    else {
      uStack_1cc4 = 0x401;
      local_1cc0[1]._0_4_ = 0.0;
      local_1cc0[1]._4_4_ = 0.0;
      local_1cc0[1]._8_4_ = 0.0;
      local_1cc0[1]._12_4_ = 0.0;
      local_1cc0[3]._0_4_ = 1.12104e-44;
      local_1cc0[3]._4_4_ = 0.0;
      tbb::detail::r1::initialize((task_group_context *)local_1cd0);
      BVar35 = BStack_18b8;
      BVar33 = local_18c0;
      BStack_18b8.lower = BVar34.lower;
      BStack_18b8.upper = BVar34.upper;
      local_1e10.m128[0] = BStack_18b8.lower;
      local_1e10.m128[1] = BStack_18b8.upper;
      local_18c0.lower = BVar40.lower;
      local_18c0.upper = BVar40.upper;
      local_1e10.m128[2] = local_18c0.lower;
      local_1e10.m128[3] = local_18c0.upper;
      uStack_1e00 = 0x400;
      local_1a40._0_8_ = &local_1ac0;
      local_1a40._8_8_ = local_19b0;
      local_18c0 = BVar33;
      BStack_18b8 = BVar35;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::avx::GridRecalculatePrimRef>(embree::avx::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)local_1d60,(d1 *)&local_1e10.field_1,
                 (blocked_range<unsigned_long> *)((long)&local_1bc8 + 8),
                 (LBBox<embree::Vec3fa> *)(local_1a50 + 0x10),
                 (anon_class_16_2_ed117de8_conflict22 *)local_1a40._0_8_,
                 (anon_class_1_0_00000001 *)local_1cd0,in_stack_ffffffffffffe080);
      cVar36 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_1cd0);
      if (cVar36 != '\0') {
        prVar49 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar49,"task cancelled");
        __cxa_throw(prVar49,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)local_1cd0);
    }
    (local_1e78->ref).ptr = uVar68;
    *(undefined8 *)&(local_1e78->lbounds).bounds0.lower.field_0 = local_1d60._0_8_;
    *(ulong *)((long)&(local_1e78->lbounds).bounds0.lower.field_0 + 8) =
         CONCAT44(local_1d60._12_4_,local_1d60._8_4_);
    *(ulong *)&(local_1e78->lbounds).bounds0.upper.field_0 =
         CONCAT44(aStack_1d50.m128[1],aStack_1d50.m128[0]);
    *(ulong *)((long)&(local_1e78->lbounds).bounds0.upper.field_0 + 8) =
         CONCAT44(aStack_1d50.m128[3],aStack_1d50.m128[2]);
    *(ulong *)&(local_1e78->lbounds).bounds1.lower.field_0 =
         CONCAT44(local_1d40.i[1],local_1d40.i[0]);
    *(ulong *)((long)&(local_1e78->lbounds).bounds1.lower.field_0 + 8) =
         CONCAT44(local_1d40.i[3],local_1d40.i[2]);
    uVar57 = CONCAT44(aStack_1d30.i[1],aStack_1d30.i[0]);
    uVar81 = CONCAT44(aStack_1d30.i[3],aStack_1d30.i[2]);
  }
  *(unsigned_long *)&(local_1e78->lbounds).bounds1.upper.field_0 = uVar57;
  *(unsigned_long *)((long)&(local_1e78->lbounds).bounds1.upper.field_0 + 8) = uVar81;
  local_1e78->dt = BStack_1898;
  if (local_2c0 == 0) {
    return local_1e78;
  }
  uVar68 = 0;
  do {
    pBVar14 = local_340[uVar68];
    pBVar51 = pBVar14 + 1;
    *pBVar51 = (BBox1f)((long)*pBVar51 + -1);
    if ((*pBVar51 == (BBox1f)0x0) && (BVar40 = *pBVar14, BVar40 != (BBox1f)0x0)) {
      lVar39 = *(undefined8 *)((long)BVar40 + 0x18);
      pvVar41 = *(void **)((long)BVar40 + 0x20);
      if (pvVar41 != (void *)0x0) {
        if ((ulong)(lVar39 * 0x50) < 0x1c00000) {
          alignedFree(pvVar41);
        }
        else {
          os_free(pvVar41,lVar39 * 0x50,*(bool *)((long)BVar40 + 8));
        }
      }
      if (lVar39 != 0) {
        (**(code **)**(undefined8 **)BVar40)(*(undefined8 **)BVar40,lVar39 * -0x50,1);
      }
      *(undefined8 *)((long)BVar40 + 0x10) = 0;
      *(undefined8 *)((long)BVar40 + 0x18) = 0;
      *(undefined8 *)((long)BVar40 + 0x20) = 0;
      operator_delete((void *)BVar40);
    }
    uVar68 = uVar68 + 1;
  } while (uVar68 < local_2c0);
  return local_1e78;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }